

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx::CurveNiIntersector1<8>::
     intersect_n<embree::avx::OrientedCurve1Intersector1<embree::BSplineCurveT,7,8>,embree::avx::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  ulong uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Primitive PVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  void *pvVar12;
  __int_type_conflict _Var13;
  long lVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  uint uVar66;
  uint uVar67;
  long lVar68;
  uint uVar69;
  ulong uVar71;
  ulong uVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar107 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar108 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  float fVar135;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar162;
  float fVar163;
  float fVar165;
  float fVar166;
  float fVar167;
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  float fVar164;
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  float t1;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  float fVar200;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  float fVar221;
  float fVar232;
  float fVar233;
  vfloat4 b0;
  undefined1 auVar222 [16];
  float fVar234;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  float fVar235;
  float fVar237;
  float fVar238;
  undefined1 auVar229 [32];
  undefined1 auVar236 [16];
  undefined1 auVar231 [64];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [64];
  float fVar263;
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  float fVar264;
  undefined1 auVar261 [32];
  float fVar265;
  undefined1 auVar262 [64];
  float fVar266;
  float fVar275;
  float fVar276;
  __m128 a;
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  float fVar278;
  float fVar279;
  float fVar280;
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  float fVar277;
  undefined1 auVar273 [32];
  undefined1 auVar274 [64];
  vfloat4 a0;
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar284 [16];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [64];
  vfloat4 a0_1;
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [64];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  float fVar301;
  float fVar309;
  undefined1 auVar304 [16];
  float fVar307;
  float fVar308;
  float fVar310;
  float fVar311;
  float fVar312;
  float in_register_0000151c;
  undefined1 auVar305 [32];
  float fVar313;
  undefined1 auVar306 [64];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [32];
  float fVar318;
  undefined1 auVar317 [64];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  float in_register_0000159c;
  undefined1 auVar325 [32];
  undefined1 auVar327 [64];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  float fVar331;
  float in_register_000015dc;
  undefined1 auVar330 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_4f8 [8];
  float fStack_4f0;
  float fStack_4ec;
  int local_4cc;
  undefined1 local_4c8 [8];
  float fStack_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  ulong local_4a0;
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  undefined1 auStack_488 [16];
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  RTCFilterFunctionNArguments local_318;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 auStack_2c8 [16];
  uint auStack_2b8 [4];
  undefined8 local_2a8;
  float local_2a0;
  undefined8 local_29c;
  uint local_294;
  uint local_290;
  uint local_28c;
  uint local_288;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  float afStack_1d8 [8];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar70;
  undefined1 auVar230 [32];
  undefined1 auVar326 [32];
  
  PVar9 = prim[1];
  uVar72 = (ulong)(byte)PVar9;
  fVar135 = *(float *)(prim + uVar72 * 0x19 + 0x12);
  auVar81 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar72 * 0x19 + 6));
  auVar103._0_4_ = fVar135 * auVar81._0_4_;
  auVar103._4_4_ = fVar135 * auVar81._4_4_;
  auVar103._8_4_ = fVar135 * auVar81._8_4_;
  auVar103._12_4_ = fVar135 * auVar81._12_4_;
  auVar222._0_4_ = fVar135 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar222._4_4_ = fVar135 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar222._8_4_ = fVar135 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar222._12_4_ = fVar135 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 4 + 6)));
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 4 + 10)));
  auVar92._16_16_ = auVar204;
  auVar92._0_16_ = auVar81;
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 5 + 6)));
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 5 + 10)));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar156._16_16_ = auVar204;
  auVar156._0_16_ = auVar81;
  auVar15 = vcvtdq2ps_avx(auVar156);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 6 + 6)));
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 6 + 10)));
  auVar175._16_16_ = auVar204;
  auVar175._0_16_ = auVar81;
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0xb + 6)));
  auVar16 = vcvtdq2ps_avx(auVar175);
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0xb + 10)));
  auVar176._16_16_ = auVar204;
  auVar176._0_16_ = auVar81;
  auVar17 = vcvtdq2ps_avx(auVar176);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0xc + 6)));
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0xc + 10)));
  auVar194._16_16_ = auVar204;
  auVar194._0_16_ = auVar81;
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0xd + 6)));
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0xd + 10)));
  auVar18 = vcvtdq2ps_avx(auVar194);
  auVar195._16_16_ = auVar204;
  auVar195._0_16_ = auVar81;
  auVar19 = vcvtdq2ps_avx(auVar195);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0x12 + 6)));
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0x12 + 10)));
  auVar196._16_16_ = auVar204;
  auVar196._0_16_ = auVar81;
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0x13 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar196);
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0x13 + 10)));
  auVar270._16_16_ = auVar204;
  auVar270._0_16_ = auVar81;
  auVar21 = vcvtdq2ps_avx(auVar270);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0x14 + 6)));
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0x14 + 10)));
  auVar288._16_16_ = auVar204;
  auVar288._0_16_ = auVar81;
  auVar22 = vcvtdq2ps_avx(auVar288);
  auVar81 = vshufps_avx(auVar222,auVar222,0);
  auVar204 = vshufps_avx(auVar222,auVar222,0x55);
  auVar154 = vshufps_avx(auVar222,auVar222,0xaa);
  fVar135 = auVar154._0_4_;
  fVar200 = auVar154._4_4_;
  fVar162 = auVar154._8_4_;
  fVar215 = auVar154._12_4_;
  fVar163 = auVar204._0_4_;
  fVar216 = auVar204._4_4_;
  fVar164 = auVar204._8_4_;
  fVar217 = auVar204._12_4_;
  fVar165 = auVar81._0_4_;
  fVar218 = auVar81._4_4_;
  fVar166 = auVar81._8_4_;
  fVar219 = auVar81._12_4_;
  auVar305._0_4_ = fVar165 * auVar92._0_4_ + fVar163 * auVar15._0_4_ + fVar135 * auVar16._0_4_;
  auVar305._4_4_ = fVar218 * auVar92._4_4_ + fVar216 * auVar15._4_4_ + fVar200 * auVar16._4_4_;
  auVar305._8_4_ = fVar166 * auVar92._8_4_ + fVar164 * auVar15._8_4_ + fVar162 * auVar16._8_4_;
  auVar305._12_4_ = fVar219 * auVar92._12_4_ + fVar217 * auVar15._12_4_ + fVar215 * auVar16._12_4_;
  auVar305._16_4_ = fVar165 * auVar92._16_4_ + fVar163 * auVar15._16_4_ + fVar135 * auVar16._16_4_;
  auVar305._20_4_ = fVar218 * auVar92._20_4_ + fVar216 * auVar15._20_4_ + fVar200 * auVar16._20_4_;
  auVar305._24_4_ = fVar166 * auVar92._24_4_ + fVar164 * auVar15._24_4_ + fVar162 * auVar16._24_4_;
  auVar305._28_4_ = fVar217 + in_register_000015dc + in_register_0000151c;
  auVar297._0_4_ = fVar165 * auVar17._0_4_ + fVar163 * auVar18._0_4_ + auVar19._0_4_ * fVar135;
  auVar297._4_4_ = fVar218 * auVar17._4_4_ + fVar216 * auVar18._4_4_ + auVar19._4_4_ * fVar200;
  auVar297._8_4_ = fVar166 * auVar17._8_4_ + fVar164 * auVar18._8_4_ + auVar19._8_4_ * fVar162;
  auVar297._12_4_ = fVar219 * auVar17._12_4_ + fVar217 * auVar18._12_4_ + auVar19._12_4_ * fVar215;
  auVar297._16_4_ = fVar165 * auVar17._16_4_ + fVar163 * auVar18._16_4_ + auVar19._16_4_ * fVar135;
  auVar297._20_4_ = fVar218 * auVar17._20_4_ + fVar216 * auVar18._20_4_ + auVar19._20_4_ * fVar200;
  auVar297._24_4_ = fVar166 * auVar17._24_4_ + fVar164 * auVar18._24_4_ + auVar19._24_4_ * fVar162;
  auVar297._28_4_ = fVar217 + in_register_000015dc + in_register_0000159c;
  auVar229._0_4_ = fVar165 * auVar20._0_4_ + fVar163 * auVar21._0_4_ + auVar22._0_4_ * fVar135;
  auVar229._4_4_ = fVar218 * auVar20._4_4_ + fVar216 * auVar21._4_4_ + auVar22._4_4_ * fVar200;
  auVar229._8_4_ = fVar166 * auVar20._8_4_ + fVar164 * auVar21._8_4_ + auVar22._8_4_ * fVar162;
  auVar229._12_4_ = fVar219 * auVar20._12_4_ + fVar217 * auVar21._12_4_ + auVar22._12_4_ * fVar215;
  auVar229._16_4_ = fVar165 * auVar20._16_4_ + fVar163 * auVar21._16_4_ + auVar22._16_4_ * fVar135;
  auVar229._20_4_ = fVar218 * auVar20._20_4_ + fVar216 * auVar21._20_4_ + auVar22._20_4_ * fVar200;
  auVar229._24_4_ = fVar166 * auVar20._24_4_ + fVar164 * auVar21._24_4_ + auVar22._24_4_ * fVar162;
  auVar229._28_4_ = fVar219 + fVar217 + fVar215;
  auVar81 = vshufps_avx(auVar103,auVar103,0);
  auVar204 = vshufps_avx(auVar103,auVar103,0x55);
  auVar154 = vshufps_avx(auVar103,auVar103,0xaa);
  fVar135 = auVar154._0_4_;
  fVar200 = auVar154._4_4_;
  fVar162 = auVar154._8_4_;
  fVar215 = auVar154._12_4_;
  fVar165 = auVar204._0_4_;
  fVar218 = auVar204._4_4_;
  fVar166 = auVar204._8_4_;
  fVar219 = auVar204._12_4_;
  fVar163 = auVar81._0_4_;
  fVar216 = auVar81._4_4_;
  fVar164 = auVar81._8_4_;
  fVar217 = auVar81._12_4_;
  auVar127._0_4_ = fVar163 * auVar92._0_4_ + fVar165 * auVar15._0_4_ + fVar135 * auVar16._0_4_;
  auVar127._4_4_ = fVar216 * auVar92._4_4_ + fVar218 * auVar15._4_4_ + fVar200 * auVar16._4_4_;
  auVar127._8_4_ = fVar164 * auVar92._8_4_ + fVar166 * auVar15._8_4_ + fVar162 * auVar16._8_4_;
  auVar127._12_4_ = fVar217 * auVar92._12_4_ + fVar219 * auVar15._12_4_ + fVar215 * auVar16._12_4_;
  auVar127._16_4_ = fVar163 * auVar92._16_4_ + fVar165 * auVar15._16_4_ + fVar135 * auVar16._16_4_;
  auVar127._20_4_ = fVar216 * auVar92._20_4_ + fVar218 * auVar15._20_4_ + fVar200 * auVar16._20_4_;
  auVar127._24_4_ = fVar164 * auVar92._24_4_ + fVar166 * auVar15._24_4_ + fVar162 * auVar16._24_4_;
  auVar127._28_4_ = auVar92._28_4_ + auVar15._28_4_ + auVar16._28_4_;
  auVar177._0_4_ = fVar163 * auVar17._0_4_ + auVar19._0_4_ * fVar135 + fVar165 * auVar18._0_4_;
  auVar177._4_4_ = fVar216 * auVar17._4_4_ + auVar19._4_4_ * fVar200 + fVar218 * auVar18._4_4_;
  auVar177._8_4_ = fVar164 * auVar17._8_4_ + auVar19._8_4_ * fVar162 + fVar166 * auVar18._8_4_;
  auVar177._12_4_ = fVar217 * auVar17._12_4_ + auVar19._12_4_ * fVar215 + fVar219 * auVar18._12_4_;
  auVar177._16_4_ = fVar163 * auVar17._16_4_ + auVar19._16_4_ * fVar135 + fVar165 * auVar18._16_4_;
  auVar177._20_4_ = fVar216 * auVar17._20_4_ + auVar19._20_4_ * fVar200 + fVar218 * auVar18._20_4_;
  auVar177._24_4_ = fVar164 * auVar17._24_4_ + auVar19._24_4_ * fVar162 + fVar166 * auVar18._24_4_;
  auVar177._28_4_ = auVar92._28_4_ + auVar19._28_4_ + auVar16._28_4_;
  auVar93._8_4_ = 0x7fffffff;
  auVar93._0_8_ = 0x7fffffff7fffffff;
  auVar93._12_4_ = 0x7fffffff;
  auVar93._16_4_ = 0x7fffffff;
  auVar93._20_4_ = 0x7fffffff;
  auVar93._24_4_ = 0x7fffffff;
  auVar93._28_4_ = 0x7fffffff;
  auVar157._8_4_ = 0x219392ef;
  auVar157._0_8_ = 0x219392ef219392ef;
  auVar157._12_4_ = 0x219392ef;
  auVar157._16_4_ = 0x219392ef;
  auVar157._20_4_ = 0x219392ef;
  auVar157._24_4_ = 0x219392ef;
  auVar157._28_4_ = 0x219392ef;
  auVar92 = vandps_avx(auVar305,auVar93);
  auVar92 = vcmpps_avx(auVar92,auVar157,1);
  auVar15 = vblendvps_avx(auVar305,auVar157,auVar92);
  auVar92 = vandps_avx(auVar297,auVar93);
  auVar92 = vcmpps_avx(auVar92,auVar157,1);
  auVar16 = vblendvps_avx(auVar297,auVar157,auVar92);
  auVar92 = vandps_avx(auVar229,auVar93);
  auVar92 = vcmpps_avx(auVar92,auVar157,1);
  auVar92 = vblendvps_avx(auVar229,auVar157,auVar92);
  auVar17 = vrcpps_avx(auVar15);
  auVar197._0_4_ = fVar163 * auVar20._0_4_ + fVar165 * auVar21._0_4_ + auVar22._0_4_ * fVar135;
  auVar197._4_4_ = fVar216 * auVar20._4_4_ + fVar218 * auVar21._4_4_ + auVar22._4_4_ * fVar200;
  auVar197._8_4_ = fVar164 * auVar20._8_4_ + fVar166 * auVar21._8_4_ + auVar22._8_4_ * fVar162;
  auVar197._12_4_ = fVar217 * auVar20._12_4_ + fVar219 * auVar21._12_4_ + auVar22._12_4_ * fVar215;
  auVar197._16_4_ = fVar163 * auVar20._16_4_ + fVar165 * auVar21._16_4_ + auVar22._16_4_ * fVar135;
  auVar197._20_4_ = fVar216 * auVar20._20_4_ + fVar218 * auVar21._20_4_ + auVar22._20_4_ * fVar200;
  auVar197._24_4_ = fVar164 * auVar20._24_4_ + fVar166 * auVar21._24_4_ + auVar22._24_4_ * fVar162;
  auVar197._28_4_ = auVar18._28_4_ + fVar215 + 1e-18;
  fVar135 = auVar17._0_4_;
  fVar162 = auVar17._4_4_;
  auVar18._4_4_ = auVar15._4_4_ * fVar162;
  auVar18._0_4_ = auVar15._0_4_ * fVar135;
  fVar163 = auVar17._8_4_;
  auVar18._8_4_ = auVar15._8_4_ * fVar163;
  fVar164 = auVar17._12_4_;
  auVar18._12_4_ = auVar15._12_4_ * fVar164;
  fVar165 = auVar17._16_4_;
  auVar18._16_4_ = auVar15._16_4_ * fVar165;
  fVar166 = auVar17._20_4_;
  auVar18._20_4_ = auVar15._20_4_ * fVar166;
  fVar167 = auVar17._24_4_;
  auVar18._24_4_ = auVar15._24_4_ * fVar167;
  auVar18._28_4_ = 0x219392ef;
  auVar271._8_4_ = 0x3f800000;
  auVar271._0_8_ = 0x3f8000003f800000;
  auVar271._12_4_ = 0x3f800000;
  auVar271._16_4_ = 0x3f800000;
  auVar271._20_4_ = 0x3f800000;
  auVar271._24_4_ = 0x3f800000;
  auVar271._28_4_ = 0x3f800000;
  auVar18 = vsubps_avx(auVar271,auVar18);
  auVar15 = vrcpps_avx(auVar16);
  fVar135 = fVar135 + fVar135 * auVar18._0_4_;
  fVar162 = fVar162 + fVar162 * auVar18._4_4_;
  fVar163 = fVar163 + fVar163 * auVar18._8_4_;
  fVar164 = fVar164 + fVar164 * auVar18._12_4_;
  fVar165 = fVar165 + fVar165 * auVar18._16_4_;
  fVar166 = fVar166 + fVar166 * auVar18._20_4_;
  fVar167 = fVar167 + fVar167 * auVar18._24_4_;
  fVar200 = auVar15._0_4_;
  fVar215 = auVar15._4_4_;
  auVar19._4_4_ = auVar16._4_4_ * fVar215;
  auVar19._0_4_ = auVar16._0_4_ * fVar200;
  fVar216 = auVar15._8_4_;
  auVar19._8_4_ = auVar16._8_4_ * fVar216;
  fVar217 = auVar15._12_4_;
  auVar19._12_4_ = auVar16._12_4_ * fVar217;
  fVar218 = auVar15._16_4_;
  auVar19._16_4_ = auVar16._16_4_ * fVar218;
  fVar219 = auVar15._20_4_;
  auVar19._20_4_ = auVar16._20_4_ * fVar219;
  fVar220 = auVar15._24_4_;
  auVar19._24_4_ = auVar16._24_4_ * fVar220;
  auVar19._28_4_ = auVar17._28_4_;
  auVar16 = vsubps_avx(auVar271,auVar19);
  auVar15 = vrcpps_avx(auVar92);
  fVar200 = fVar200 + fVar200 * auVar16._0_4_;
  fVar215 = fVar215 + fVar215 * auVar16._4_4_;
  fVar216 = fVar216 + fVar216 * auVar16._8_4_;
  fVar217 = fVar217 + fVar217 * auVar16._12_4_;
  fVar218 = fVar218 + fVar218 * auVar16._16_4_;
  fVar219 = fVar219 + fVar219 * auVar16._20_4_;
  fVar220 = fVar220 + fVar220 * auVar16._24_4_;
  fVar221 = auVar15._0_4_;
  fVar232 = auVar15._4_4_;
  auVar16._4_4_ = fVar232 * auVar92._4_4_;
  auVar16._0_4_ = fVar221 * auVar92._0_4_;
  fVar233 = auVar15._8_4_;
  auVar16._8_4_ = fVar233 * auVar92._8_4_;
  fVar234 = auVar15._12_4_;
  auVar16._12_4_ = fVar234 * auVar92._12_4_;
  fVar235 = auVar15._16_4_;
  auVar16._16_4_ = fVar235 * auVar92._16_4_;
  fVar237 = auVar15._20_4_;
  auVar16._20_4_ = fVar237 * auVar92._20_4_;
  fVar238 = auVar15._24_4_;
  auVar16._24_4_ = fVar238 * auVar92._24_4_;
  auVar16._28_4_ = auVar92._28_4_;
  auVar92 = vsubps_avx(auVar271,auVar16);
  fVar221 = fVar221 + fVar221 * auVar92._0_4_;
  fVar232 = fVar232 + fVar232 * auVar92._4_4_;
  fVar233 = fVar233 + fVar233 * auVar92._8_4_;
  fVar234 = fVar234 + fVar234 * auVar92._12_4_;
  fVar235 = fVar235 + fVar235 * auVar92._16_4_;
  fVar237 = fVar237 + fVar237 * auVar92._20_4_;
  fVar238 = fVar238 + fVar238 * auVar92._24_4_;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar72 * 7 + 6);
  auVar81 = vpmovsxwd_avx(auVar81);
  auVar204._8_8_ = 0;
  auVar204._0_8_ = *(ulong *)(prim + uVar72 * 7 + 0xe);
  auVar204 = vpmovsxwd_avx(auVar204);
  auVar94._16_16_ = auVar204;
  auVar94._0_16_ = auVar81;
  auVar92 = vcvtdq2ps_avx(auVar94);
  auVar92 = vsubps_avx(auVar92,auVar127);
  auVar154._8_8_ = 0;
  auVar154._0_8_ = *(ulong *)(prim + uVar72 * 9 + 6);
  auVar81 = vpmovsxwd_avx(auVar154);
  auVar73._0_4_ = fVar135 * auVar92._0_4_;
  auVar73._4_4_ = fVar162 * auVar92._4_4_;
  auVar73._8_4_ = fVar163 * auVar92._8_4_;
  auVar73._12_4_ = fVar164 * auVar92._12_4_;
  auVar17._16_4_ = fVar165 * auVar92._16_4_;
  auVar17._0_16_ = auVar73;
  auVar17._20_4_ = fVar166 * auVar92._20_4_;
  auVar17._24_4_ = fVar167 * auVar92._24_4_;
  auVar17._28_4_ = auVar92._28_4_;
  auVar122._8_8_ = 0;
  auVar122._0_8_ = *(ulong *)(prim + uVar72 * 9 + 0xe);
  auVar204 = vpmovsxwd_avx(auVar122);
  auVar246._16_16_ = auVar204;
  auVar246._0_16_ = auVar81;
  auVar92 = vcvtdq2ps_avx(auVar246);
  auVar92 = vsubps_avx(auVar92,auVar127);
  auVar104._0_4_ = fVar135 * auVar92._0_4_;
  auVar104._4_4_ = fVar162 * auVar92._4_4_;
  auVar104._8_4_ = fVar163 * auVar92._8_4_;
  auVar104._12_4_ = fVar164 * auVar92._12_4_;
  auVar20._16_4_ = fVar165 * auVar92._16_4_;
  auVar20._0_16_ = auVar104;
  auVar20._20_4_ = fVar166 * auVar92._20_4_;
  auVar20._24_4_ = fVar167 * auVar92._24_4_;
  auVar20._28_4_ = auVar92._28_4_;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = *(ulong *)(prim + uVar72 * 0xe + 6);
  auVar81 = vpmovsxwd_avx(auVar110);
  auVar140._8_8_ = 0;
  auVar140._0_8_ = *(ulong *)(prim + uVar72 * 0xe + 0xe);
  auVar204 = vpmovsxwd_avx(auVar140);
  auVar158._16_16_ = auVar204;
  auVar158._0_16_ = auVar81;
  auVar92 = vcvtdq2ps_avx(auVar158);
  auVar92 = vsubps_avx(auVar92,auVar177);
  auVar136._0_4_ = fVar200 * auVar92._0_4_;
  auVar136._4_4_ = fVar215 * auVar92._4_4_;
  auVar136._8_4_ = fVar216 * auVar92._8_4_;
  auVar136._12_4_ = fVar217 * auVar92._12_4_;
  auVar21._16_4_ = fVar218 * auVar92._16_4_;
  auVar21._0_16_ = auVar136;
  auVar21._20_4_ = fVar219 * auVar92._20_4_;
  auVar21._24_4_ = fVar220 * auVar92._24_4_;
  auVar21._28_4_ = auVar92._28_4_;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + 6);
  auVar81 = vpmovsxwd_avx(auVar111);
  auVar236._8_8_ = 0;
  auVar236._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + 0xe);
  auVar204 = vpmovsxwd_avx(auVar236);
  auVar247._16_16_ = auVar204;
  auVar247._0_16_ = auVar81;
  auVar92 = vcvtdq2ps_avx(auVar247);
  auVar92 = vsubps_avx(auVar92,auVar177);
  auVar168._0_4_ = fVar200 * auVar92._0_4_;
  auVar168._4_4_ = fVar215 * auVar92._4_4_;
  auVar168._8_4_ = fVar216 * auVar92._8_4_;
  auVar168._12_4_ = fVar217 * auVar92._12_4_;
  auVar22._16_4_ = fVar218 * auVar92._16_4_;
  auVar22._0_16_ = auVar168;
  auVar22._20_4_ = fVar219 * auVar92._20_4_;
  auVar22._24_4_ = fVar220 * auVar92._24_4_;
  auVar22._28_4_ = auVar92._28_4_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar72 * 0x15 + 6);
  auVar81 = vpmovsxwd_avx(auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar72 * 0x15 + 0xe);
  auVar204 = vpmovsxwd_avx(auVar7);
  auVar212._16_16_ = auVar204;
  auVar212._0_16_ = auVar81;
  auVar92 = vcvtdq2ps_avx(auVar212);
  auVar92 = vsubps_avx(auVar92,auVar197);
  auVar201._0_4_ = fVar221 * auVar92._0_4_;
  auVar201._4_4_ = fVar232 * auVar92._4_4_;
  auVar201._8_4_ = fVar233 * auVar92._8_4_;
  auVar201._12_4_ = fVar234 * auVar92._12_4_;
  auVar23._16_4_ = fVar235 * auVar92._16_4_;
  auVar23._0_16_ = auVar201;
  auVar23._20_4_ = fVar237 * auVar92._20_4_;
  auVar23._24_4_ = fVar238 * auVar92._24_4_;
  auVar23._28_4_ = auVar92._28_4_;
  auVar255._8_8_ = 0;
  auVar255._0_8_ = *(ulong *)(prim + uVar72 * 0x17 + 6);
  auVar81 = vpmovsxwd_avx(auVar255);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar72 * 0x17 + 0xe);
  auVar204 = vpmovsxwd_avx(auVar8);
  auVar248._16_16_ = auVar204;
  auVar248._0_16_ = auVar81;
  auVar92 = vcvtdq2ps_avx(auVar248);
  auVar92 = vsubps_avx(auVar92,auVar197);
  auVar179._0_4_ = fVar221 * auVar92._0_4_;
  auVar179._4_4_ = fVar232 * auVar92._4_4_;
  auVar179._8_4_ = fVar233 * auVar92._8_4_;
  auVar179._12_4_ = fVar234 * auVar92._12_4_;
  auVar24._16_4_ = fVar235 * auVar92._16_4_;
  auVar24._0_16_ = auVar179;
  auVar24._20_4_ = fVar237 * auVar92._20_4_;
  auVar24._24_4_ = fVar238 * auVar92._24_4_;
  auVar24._28_4_ = auVar92._28_4_;
  auVar81 = vpminsd_avx(auVar17._16_16_,auVar20._16_16_);
  auVar204 = vpminsd_avx(auVar73,auVar104);
  auVar289._16_16_ = auVar81;
  auVar289._0_16_ = auVar204;
  auVar81 = vpminsd_avx(auVar21._16_16_,auVar22._16_16_);
  auVar204 = vpminsd_avx(auVar136,auVar168);
  auVar298._16_16_ = auVar81;
  auVar298._0_16_ = auVar204;
  auVar92 = vmaxps_avx(auVar289,auVar298);
  auVar81 = vpminsd_avx(auVar23._16_16_,auVar24._16_16_);
  auVar204 = vpminsd_avx(auVar201,auVar179);
  auVar316._16_16_ = auVar81;
  auVar316._0_16_ = auVar204;
  uVar2 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar325._4_4_ = uVar2;
  auVar325._0_4_ = uVar2;
  auVar325._8_4_ = uVar2;
  auVar325._12_4_ = uVar2;
  auVar325._16_4_ = uVar2;
  auVar325._20_4_ = uVar2;
  auVar325._24_4_ = uVar2;
  auVar325._28_4_ = uVar2;
  auVar15 = vmaxps_avx(auVar316,auVar325);
  auVar92 = vmaxps_avx(auVar92,auVar15);
  local_1b8._4_4_ = auVar92._4_4_ * 0.99999964;
  local_1b8._0_4_ = auVar92._0_4_ * 0.99999964;
  local_1b8._8_4_ = auVar92._8_4_ * 0.99999964;
  local_1b8._12_4_ = auVar92._12_4_ * 0.99999964;
  local_1b8._16_4_ = auVar92._16_4_ * 0.99999964;
  local_1b8._20_4_ = auVar92._20_4_ * 0.99999964;
  local_1b8._24_4_ = auVar92._24_4_ * 0.99999964;
  local_1b8._28_4_ = auVar92._28_4_;
  auVar81 = vpmaxsd_avx(auVar17._16_16_,auVar20._16_16_);
  auVar204 = vpmaxsd_avx(auVar73,auVar104);
  auVar95._16_16_ = auVar81;
  auVar95._0_16_ = auVar204;
  auVar81 = vpmaxsd_avx(auVar21._16_16_,auVar22._16_16_);
  auVar204 = vpmaxsd_avx(auVar136,auVar168);
  auVar128._16_16_ = auVar81;
  auVar128._0_16_ = auVar204;
  auVar92 = vminps_avx(auVar95,auVar128);
  auVar81 = vpmaxsd_avx(auVar23._16_16_,auVar24._16_16_);
  auVar204 = vpmaxsd_avx(auVar201,auVar179);
  auVar129._16_16_ = auVar81;
  auVar129._0_16_ = auVar204;
  fVar135 = (ray->super_RayK<1>).tfar;
  auVar159._4_4_ = fVar135;
  auVar159._0_4_ = fVar135;
  auVar159._8_4_ = fVar135;
  auVar159._12_4_ = fVar135;
  auVar159._16_4_ = fVar135;
  auVar159._20_4_ = fVar135;
  auVar159._24_4_ = fVar135;
  auVar159._28_4_ = fVar135;
  auVar15 = vminps_avx(auVar129,auVar159);
  auVar92 = vminps_avx(auVar92,auVar15);
  auVar15._4_4_ = auVar92._4_4_ * 1.0000004;
  auVar15._0_4_ = auVar92._0_4_ * 1.0000004;
  auVar15._8_4_ = auVar92._8_4_ * 1.0000004;
  auVar15._12_4_ = auVar92._12_4_ * 1.0000004;
  auVar15._16_4_ = auVar92._16_4_ * 1.0000004;
  auVar15._20_4_ = auVar92._20_4_ * 1.0000004;
  auVar15._24_4_ = auVar92._24_4_ * 1.0000004;
  auVar15._28_4_ = auVar92._28_4_;
  auVar92 = vcmpps_avx(local_1b8,auVar15,2);
  auVar81 = vpshufd_avx(ZEXT116((byte)PVar9),0);
  auVar130._16_16_ = auVar81;
  auVar130._0_16_ = auVar81;
  auVar15 = vcvtdq2ps_avx(auVar130);
  auVar15 = vcmpps_avx(_DAT_01f7b060,auVar15,1);
  auVar92 = vandps_avx(auVar92,auVar15);
  uVar66 = vmovmskps_avx(auVar92);
  auVar96._16_16_ = mm_lookupmask_ps._240_16_;
  auVar96._0_16_ = mm_lookupmask_ps._240_16_;
  local_198 = vblendps_avx(auVar96,ZEXT832(0) << 0x20,0x80);
LAB_009c1876:
  uVar72 = (ulong)uVar66;
  if (uVar72 == 0) {
    return;
  }
  lVar68 = 0;
  if (uVar72 != 0) {
    for (; (uVar66 >> lVar68 & 1) == 0; lVar68 = lVar68 + 1) {
    }
  }
  uVar66 = *(uint *)(prim + 2);
  pGVar10 = (context->scene->geometries).items[uVar66].ptr;
  local_4a0 = (ulong)*(uint *)(prim + lVar68 * 4 + 6);
  uVar71 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                           pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar68 * 4 + 6));
  p_Var11 = pGVar10[1].intersectionFilterN;
  pvVar12 = pGVar10[2].userPtr;
  _Var13 = pGVar10[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar81 = *(undefined1 (*) [16])(_Var13 + uVar71 * (long)pvVar12);
  pfVar1 = (float *)(_Var13 + (uVar71 + 1) * (long)pvVar12);
  fVar135 = *pfVar1;
  fVar200 = pfVar1[1];
  fVar162 = pfVar1[2];
  fVar215 = pfVar1[3];
  pfVar1 = (float *)(_Var13 + (uVar71 + 2) * (long)pvVar12);
  fVar163 = *pfVar1;
  fVar216 = pfVar1[1];
  fVar164 = pfVar1[2];
  fVar217 = pfVar1[3];
  pfVar1 = (float *)(_Var13 + (long)pvVar12 * (uVar71 + 3));
  fVar165 = *pfVar1;
  fVar218 = pfVar1[1];
  fVar166 = pfVar1[2];
  fVar219 = pfVar1[3];
  uVar72 = uVar72 - 1 & uVar72;
  lVar68 = *(long *)&pGVar10[1].time_range.upper;
  pfVar1 = (float *)(lVar68 + (long)p_Var11 * uVar71);
  fVar167 = *pfVar1;
  fVar220 = pfVar1[1];
  fVar221 = pfVar1[2];
  fVar232 = pfVar1[3];
  pfVar1 = (float *)(lVar68 + (long)p_Var11 * (uVar71 + 1));
  fVar233 = *pfVar1;
  fVar234 = pfVar1[1];
  fVar235 = pfVar1[2];
  fVar237 = pfVar1[3];
  pfVar1 = (float *)(lVar68 + (long)p_Var11 * (uVar71 + 2));
  fVar238 = *pfVar1;
  fVar301 = pfVar1[1];
  fVar263 = pfVar1[2];
  fVar307 = pfVar1[3];
  lVar14 = 0;
  if (uVar72 != 0) {
    for (; (uVar72 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
    }
  }
  pfVar1 = (float *)(lVar68 + (long)p_Var11 * (uVar71 + 3));
  fVar264 = *pfVar1;
  fVar308 = pfVar1[1];
  fVar265 = pfVar1[2];
  fVar309 = pfVar1[3];
  if (((uVar72 != 0) && (uVar71 = uVar72 - 1 & uVar72, uVar71 != 0)) && (lVar68 = 0, uVar71 != 0)) {
    for (; (uVar71 >> lVar68 & 1) == 0; lVar68 = lVar68 + 1) {
    }
  }
  local_4f8._0_4_ =
       fVar167 * 0.16666667 + fVar233 * 0.6666667 + fVar238 * 0.16666667 + fVar264 * 0.0;
  local_4f8._4_4_ =
       fVar220 * 0.16666667 + fVar234 * 0.6666667 + fVar301 * 0.16666667 + fVar308 * 0.0;
  fStack_4f0 = fVar221 * 0.16666667 + fVar235 * 0.6666667 + fVar263 * 0.16666667 + fVar265 * 0.0;
  fStack_4ec = fVar232 * 0.16666667 + fVar237 * 0.6666667 + fVar307 * 0.16666667 + fVar309 * 0.0;
  auVar105._0_4_ = fVar238 * 0.5 + fVar264 * 0.0;
  auVar105._4_4_ = fVar301 * 0.5 + fVar308 * 0.0;
  auVar105._8_4_ = fVar263 * 0.5 + fVar265 * 0.0;
  auVar105._12_4_ = fVar307 * 0.5 + fVar309 * 0.0;
  auVar281._0_4_ = fVar233 * 0.0;
  auVar281._4_4_ = fVar234 * 0.0;
  auVar281._8_4_ = fVar235 * 0.0;
  auVar281._12_4_ = fVar237 * 0.0;
  auVar204 = vsubps_avx(auVar105,auVar281);
  auVar282._0_4_ = fVar167 * 0.5;
  auVar282._4_4_ = fVar220 * 0.5;
  auVar282._8_4_ = fVar221 * 0.5;
  auVar282._12_4_ = fVar232 * 0.5;
  auVar236 = vsubps_avx(auVar204,auVar282);
  fVar266 = auVar81._0_4_;
  fVar275 = auVar81._4_4_;
  fVar276 = auVar81._8_4_;
  fVar277 = auVar81._12_4_;
  auVar283._0_4_ = fVar266 * 0.16666667 + fVar135 * 0.6666667 + fVar163 * 0.16666667 + fVar165 * 0.0
  ;
  auVar283._4_4_ = fVar275 * 0.16666667 + fVar200 * 0.6666667 + fVar216 * 0.16666667 + fVar218 * 0.0
  ;
  auVar283._8_4_ = fVar276 * 0.16666667 + fVar162 * 0.6666667 + fVar164 * 0.16666667 + fVar166 * 0.0
  ;
  auVar283._12_4_ =
       fVar277 * 0.16666667 + fVar215 * 0.6666667 + fVar217 * 0.16666667 + fVar219 * 0.0;
  auVar292._0_4_ = fVar163 * 0.5 + fVar165 * 0.0;
  auVar292._4_4_ = fVar216 * 0.5 + fVar218 * 0.0;
  auVar292._8_4_ = fVar164 * 0.5 + fVar166 * 0.0;
  auVar292._12_4_ = fVar217 * 0.5 + fVar219 * 0.0;
  auVar302._0_4_ = fVar135 * 0.0;
  auVar302._4_4_ = fVar200 * 0.0;
  auVar302._8_4_ = fVar162 * 0.0;
  auVar302._12_4_ = fVar215 * 0.0;
  auVar81 = vsubps_avx(auVar292,auVar302);
  auVar303._0_4_ = fVar266 * 0.5;
  auVar303._4_4_ = fVar275 * 0.5;
  auVar303._8_4_ = fVar276 * 0.5;
  auVar303._12_4_ = fVar277 * 0.5;
  auVar122 = vsubps_avx(auVar81,auVar303);
  auVar314._0_4_ = fVar167 * 0.0;
  auVar314._4_4_ = fVar220 * 0.0;
  auVar314._8_4_ = fVar221 * 0.0;
  auVar314._12_4_ = fVar232 * 0.0;
  local_4c8._0_4_ =
       auVar314._0_4_ + fVar233 * 0.16666667 + fVar238 * 0.6666667 + fVar264 * 0.16666667;
  local_4c8._4_4_ =
       auVar314._4_4_ + fVar234 * 0.16666667 + fVar301 * 0.6666667 + fVar308 * 0.16666667;
  fStack_4c0 = auVar314._8_4_ + fVar235 * 0.16666667 + fVar263 * 0.6666667 + fVar265 * 0.16666667;
  fStack_4bc = auVar314._12_4_ + fVar237 * 0.16666667 + fVar307 * 0.6666667 + fVar309 * 0.16666667;
  auVar251._0_4_ = fVar238 * 0.0 + fVar264 * 0.5;
  auVar251._4_4_ = fVar301 * 0.0 + fVar308 * 0.5;
  auVar251._8_4_ = fVar263 * 0.0 + fVar265 * 0.5;
  auVar251._12_4_ = fVar307 * 0.0 + fVar309 * 0.5;
  auVar169._0_4_ = fVar233 * 0.5;
  auVar169._4_4_ = fVar234 * 0.5;
  auVar169._8_4_ = fVar235 * 0.5;
  auVar169._12_4_ = fVar237 * 0.5;
  auVar81 = vsubps_avx(auVar251,auVar169);
  auVar6 = vsubps_avx(auVar81,auVar314);
  auVar202._0_4_ = fVar266 * 0.0;
  auVar202._4_4_ = fVar275 * 0.0;
  auVar202._8_4_ = fVar276 * 0.0;
  auVar202._12_4_ = fVar277 * 0.0;
  auVar252._0_4_ =
       fVar135 * 0.16666667 + fVar163 * 0.6666667 + fVar165 * 0.16666667 + auVar202._0_4_;
  auVar252._4_4_ =
       fVar200 * 0.16666667 + fVar216 * 0.6666667 + fVar218 * 0.16666667 + auVar202._4_4_;
  auVar252._8_4_ =
       fVar162 * 0.16666667 + fVar164 * 0.6666667 + fVar166 * 0.16666667 + auVar202._8_4_;
  auVar252._12_4_ =
       fVar215 * 0.16666667 + fVar217 * 0.6666667 + fVar219 * 0.16666667 + auVar202._12_4_;
  auVar223._0_4_ = fVar163 * 0.0 + fVar165 * 0.5;
  auVar223._4_4_ = fVar216 * 0.0 + fVar218 * 0.5;
  auVar223._8_4_ = fVar164 * 0.0 + fVar166 * 0.5;
  auVar223._12_4_ = fVar217 * 0.0 + fVar219 * 0.5;
  auVar180._0_4_ = fVar135 * 0.5;
  auVar180._4_4_ = fVar200 * 0.5;
  auVar180._8_4_ = fVar162 * 0.5;
  auVar180._12_4_ = fVar215 * 0.5;
  auVar81 = vsubps_avx(auVar223,auVar180);
  auVar140 = vsubps_avx(auVar81,auVar202);
  auVar81 = vshufps_avx(auVar236,auVar236,0xc9);
  auVar204 = vshufps_avx(auVar283,auVar283,0xc9);
  fVar233 = auVar236._0_4_;
  auVar224._0_4_ = fVar233 * auVar204._0_4_;
  fVar234 = auVar236._4_4_;
  auVar224._4_4_ = fVar234 * auVar204._4_4_;
  fVar235 = auVar236._8_4_;
  auVar224._8_4_ = fVar235 * auVar204._8_4_;
  fVar237 = auVar236._12_4_;
  auVar224._12_4_ = fVar237 * auVar204._12_4_;
  auVar239._0_4_ = auVar283._0_4_ * auVar81._0_4_;
  auVar239._4_4_ = auVar283._4_4_ * auVar81._4_4_;
  auVar239._8_4_ = auVar283._8_4_ * auVar81._8_4_;
  auVar239._12_4_ = auVar283._12_4_ * auVar81._12_4_;
  auVar204 = vsubps_avx(auVar239,auVar224);
  auVar154 = vshufps_avx(auVar204,auVar204,0xc9);
  auVar204 = vshufps_avx(auVar122,auVar122,0xc9);
  auVar225._0_4_ = fVar233 * auVar204._0_4_;
  auVar225._4_4_ = fVar234 * auVar204._4_4_;
  auVar225._8_4_ = fVar235 * auVar204._8_4_;
  auVar225._12_4_ = fVar237 * auVar204._12_4_;
  auVar181._0_4_ = auVar122._0_4_ * auVar81._0_4_;
  auVar181._4_4_ = auVar122._4_4_ * auVar81._4_4_;
  auVar181._8_4_ = auVar122._8_4_ * auVar81._8_4_;
  auVar181._12_4_ = auVar122._12_4_ * auVar81._12_4_;
  auVar81 = vsubps_avx(auVar181,auVar225);
  auVar122 = vshufps_avx(auVar81,auVar81,0xc9);
  auVar81 = vshufps_avx(auVar6,auVar6,0xc9);
  auVar204 = vshufps_avx(auVar252,auVar252,0xc9);
  fVar167 = auVar6._0_4_;
  auVar182._0_4_ = fVar167 * auVar204._0_4_;
  fVar220 = auVar6._4_4_;
  auVar182._4_4_ = fVar220 * auVar204._4_4_;
  fVar221 = auVar6._8_4_;
  auVar182._8_4_ = fVar221 * auVar204._8_4_;
  fVar232 = auVar6._12_4_;
  auVar182._12_4_ = fVar232 * auVar204._12_4_;
  auVar253._0_4_ = auVar252._0_4_ * auVar81._0_4_;
  auVar253._4_4_ = auVar252._4_4_ * auVar81._4_4_;
  auVar253._8_4_ = auVar252._8_4_ * auVar81._8_4_;
  auVar253._12_4_ = auVar252._12_4_ * auVar81._12_4_;
  auVar204 = vsubps_avx(auVar253,auVar182);
  auVar110 = vshufps_avx(auVar204,auVar204,0xc9);
  auVar204 = vshufps_avx(auVar140,auVar140,0xc9);
  auVar254._0_4_ = auVar204._0_4_ * fVar167;
  auVar254._4_4_ = auVar204._4_4_ * fVar220;
  auVar254._8_4_ = auVar204._8_4_ * fVar221;
  auVar254._12_4_ = auVar204._12_4_ * fVar232;
  auVar203._0_4_ = auVar81._0_4_ * auVar140._0_4_;
  auVar203._4_4_ = auVar81._4_4_ * auVar140._4_4_;
  auVar203._8_4_ = auVar81._8_4_ * auVar140._8_4_;
  auVar203._12_4_ = auVar81._12_4_ * auVar140._12_4_;
  auVar81 = vdpps_avx(auVar154,auVar154,0x7f);
  auVar204 = vsubps_avx(auVar203,auVar254);
  auVar140 = vshufps_avx(auVar204,auVar204,0xc9);
  fVar163 = auVar81._0_4_;
  auVar255 = ZEXT416((uint)fVar163);
  auVar204 = vrsqrtss_avx(auVar255,auVar255);
  fVar135 = auVar204._0_4_;
  auVar204 = ZEXT416((uint)(fVar135 * 1.5 - fVar163 * 0.5 * fVar135 * fVar135 * fVar135));
  auVar111 = vshufps_avx(auVar204,auVar204,0);
  fVar135 = auVar111._0_4_ * auVar154._0_4_;
  fVar200 = auVar111._4_4_ * auVar154._4_4_;
  fVar162 = auVar111._8_4_ * auVar154._8_4_;
  fVar215 = auVar111._12_4_ * auVar154._12_4_;
  auVar204 = vdpps_avx(auVar154,auVar122,0x7f);
  auVar81 = vshufps_avx(auVar81,auVar81,0);
  auVar267._0_4_ = auVar122._0_4_ * auVar81._0_4_;
  auVar267._4_4_ = auVar122._4_4_ * auVar81._4_4_;
  auVar267._8_4_ = auVar122._8_4_ * auVar81._8_4_;
  auVar267._12_4_ = auVar122._12_4_ * auVar81._12_4_;
  auVar81 = vshufps_avx(auVar204,auVar204,0);
  auVar240._0_4_ = auVar81._0_4_ * auVar154._0_4_;
  auVar240._4_4_ = auVar81._4_4_ * auVar154._4_4_;
  auVar240._8_4_ = auVar81._8_4_ * auVar154._8_4_;
  auVar240._12_4_ = auVar81._12_4_ * auVar154._12_4_;
  auVar7 = vsubps_avx(auVar267,auVar240);
  auVar81 = vrcpss_avx(auVar255,auVar255);
  auVar81 = ZEXT416((uint)(auVar81._0_4_ * (2.0 - fVar163 * auVar81._0_4_)));
  auVar154 = vshufps_avx(auVar81,auVar81,0);
  auVar81 = vdpps_avx(auVar110,auVar110,0x7f);
  fVar163 = auVar81._0_4_;
  auVar255 = ZEXT416((uint)fVar163);
  auVar204 = vrsqrtss_avx(auVar255,auVar255);
  fVar216 = auVar204._0_4_;
  auVar204 = vdpps_avx(auVar110,auVar140,0x7f);
  auVar122 = ZEXT416((uint)(fVar216 * 1.5 - fVar163 * 0.5 * fVar216 * fVar216 * fVar216));
  auVar122 = vshufps_avx(auVar122,auVar122,0);
  fVar216 = auVar122._0_4_ * auVar110._0_4_;
  fVar164 = auVar122._4_4_ * auVar110._4_4_;
  fVar217 = auVar122._8_4_ * auVar110._8_4_;
  fVar165 = auVar122._12_4_ * auVar110._12_4_;
  auVar81 = vshufps_avx(auVar81,auVar81,0);
  auVar226._0_4_ = auVar81._0_4_ * auVar140._0_4_;
  auVar226._4_4_ = auVar81._4_4_ * auVar140._4_4_;
  auVar226._8_4_ = auVar81._8_4_ * auVar140._8_4_;
  auVar226._12_4_ = auVar81._12_4_ * auVar140._12_4_;
  auVar81 = vshufps_avx(auVar204,auVar204,0);
  auVar183._0_4_ = auVar81._0_4_ * auVar110._0_4_;
  auVar183._4_4_ = auVar81._4_4_ * auVar110._4_4_;
  auVar183._8_4_ = auVar81._8_4_ * auVar110._8_4_;
  auVar183._12_4_ = auVar81._12_4_ * auVar110._12_4_;
  auVar140 = vsubps_avx(auVar226,auVar183);
  auVar81 = vrcpss_avx(auVar255,auVar255);
  auVar81 = ZEXT416((uint)((2.0 - fVar163 * auVar81._0_4_) * auVar81._0_4_));
  auVar81 = vshufps_avx(auVar81,auVar81,0);
  auVar204 = vshufps_avx(_local_4f8,_local_4f8,0xff);
  auVar256._0_4_ = auVar204._0_4_ * fVar135;
  auVar256._4_4_ = auVar204._4_4_ * fVar200;
  auVar256._8_4_ = auVar204._8_4_ * fVar162;
  auVar256._12_4_ = auVar204._12_4_ * fVar215;
  _local_3f8 = vsubps_avx(_local_4f8,auVar256);
  auVar110 = vshufps_avx(auVar236,auVar236,0xff);
  auVar205._0_4_ =
       auVar110._0_4_ * fVar135 + auVar204._0_4_ * auVar111._0_4_ * auVar154._0_4_ * auVar7._0_4_;
  auVar205._4_4_ =
       auVar110._4_4_ * fVar200 + auVar204._4_4_ * auVar111._4_4_ * auVar154._4_4_ * auVar7._4_4_;
  auVar205._8_4_ =
       auVar110._8_4_ * fVar162 + auVar204._8_4_ * auVar111._8_4_ * auVar154._8_4_ * auVar7._8_4_;
  auVar205._12_4_ =
       auVar110._12_4_ * fVar215 +
       auVar204._12_4_ * auVar111._12_4_ * auVar154._12_4_ * auVar7._12_4_;
  auVar110 = vsubps_avx(auVar236,auVar205);
  local_408._0_4_ = auVar256._0_4_ + (float)local_4f8._0_4_;
  local_408._4_4_ = auVar256._4_4_ + (float)local_4f8._4_4_;
  fStack_400 = auVar256._8_4_ + fStack_4f0;
  fStack_3fc = auVar256._12_4_ + fStack_4ec;
  auVar204 = vshufps_avx(_local_4c8,_local_4c8,0xff);
  auVar106._0_4_ = fVar216 * auVar204._0_4_;
  auVar106._4_4_ = fVar164 * auVar204._4_4_;
  auVar106._8_4_ = fVar217 * auVar204._8_4_;
  auVar106._12_4_ = fVar165 * auVar204._12_4_;
  _local_418 = vsubps_avx(_local_4c8,auVar106);
  auVar154 = vshufps_avx(auVar6,auVar6,0xff);
  auVar74._0_4_ =
       fVar216 * auVar154._0_4_ + auVar204._0_4_ * auVar122._0_4_ * auVar140._0_4_ * auVar81._0_4_;
  auVar74._4_4_ =
       fVar164 * auVar154._4_4_ + auVar204._4_4_ * auVar122._4_4_ * auVar140._4_4_ * auVar81._4_4_;
  auVar74._8_4_ =
       fVar217 * auVar154._8_4_ + auVar204._8_4_ * auVar122._8_4_ * auVar140._8_4_ * auVar81._8_4_;
  auVar74._12_4_ =
       fVar165 * auVar154._12_4_ +
       auVar204._12_4_ * auVar122._12_4_ * auVar140._12_4_ * auVar81._12_4_;
  auVar81 = vsubps_avx(auVar6,auVar74);
  local_478 = (float)local_4c8._0_4_ + auVar106._0_4_;
  fStack_474 = (float)local_4c8._4_4_ + auVar106._4_4_;
  fStack_470 = fStack_4c0 + auVar106._8_4_;
  fStack_46c = fStack_4bc + auVar106._12_4_;
  local_428._0_4_ = local_3f8._0_4_ + auVar110._0_4_ * 0.33333334;
  local_428._4_4_ = local_3f8._4_4_ + auVar110._4_4_ * 0.33333334;
  fStack_420 = local_3f8._8_4_ + auVar110._8_4_ * 0.33333334;
  fStack_41c = local_3f8._12_4_ + auVar110._12_4_ * 0.33333334;
  auVar75._0_4_ = auVar81._0_4_ * 0.33333334;
  auVar75._4_4_ = auVar81._4_4_ * 0.33333334;
  auVar75._8_4_ = auVar81._8_4_ * 0.33333334;
  auVar75._12_4_ = auVar81._12_4_ * 0.33333334;
  _local_438 = vsubps_avx(_local_418,auVar75);
  aVar5 = (ray->super_RayK<1>).org.field_0;
  auVar154 = vsubps_avx(_local_3f8,(undefined1  [16])aVar5);
  auVar204 = vmovsldup_avx(auVar154);
  auVar81 = vmovshdup_avx(auVar154);
  auVar154 = vshufps_avx(auVar154,auVar154,0xaa);
  fVar135 = (pre->ray_space).vx.field_0.m128[0];
  fVar200 = (pre->ray_space).vx.field_0.m128[1];
  fVar162 = (pre->ray_space).vx.field_0.m128[2];
  fVar215 = (pre->ray_space).vx.field_0.m128[3];
  fVar163 = (pre->ray_space).vy.field_0.m128[0];
  fVar216 = (pre->ray_space).vy.field_0.m128[1];
  fVar164 = (pre->ray_space).vy.field_0.m128[2];
  fVar217 = (pre->ray_space).vy.field_0.m128[3];
  fVar165 = (pre->ray_space).vz.field_0.m128[0];
  fVar218 = (pre->ray_space).vz.field_0.m128[1];
  fVar166 = (pre->ray_space).vz.field_0.m128[2];
  fVar219 = (pre->ray_space).vz.field_0.m128[3];
  local_4f8._4_4_ = fVar200 * auVar204._4_4_ + fVar216 * auVar81._4_4_ + fVar218 * auVar154._4_4_;
  local_4f8._0_4_ = fVar135 * auVar204._0_4_ + fVar163 * auVar81._0_4_ + fVar165 * auVar154._0_4_;
  fStack_4f0 = fVar162 * auVar204._8_4_ + fVar164 * auVar81._8_4_ + fVar166 * auVar154._8_4_;
  fStack_4ec = fVar215 * auVar204._12_4_ + fVar217 * auVar81._12_4_ + fVar219 * auVar154._12_4_;
  auVar154 = vsubps_avx(_local_428,(undefined1  [16])aVar5);
  auVar204 = vmovsldup_avx(auVar154);
  auVar81 = vmovshdup_avx(auVar154);
  auVar154 = vshufps_avx(auVar154,auVar154,0xaa);
  local_4c8._4_4_ = fVar200 * auVar204._4_4_ + auVar81._4_4_ * fVar216 + fVar218 * auVar154._4_4_;
  local_4c8._0_4_ = fVar135 * auVar204._0_4_ + auVar81._0_4_ * fVar163 + fVar165 * auVar154._0_4_;
  fStack_4c0 = fVar162 * auVar204._8_4_ + auVar81._8_4_ * fVar164 + fVar166 * auVar154._8_4_;
  fStack_4bc = fVar215 * auVar204._12_4_ + auVar81._12_4_ * fVar217 + fVar219 * auVar154._12_4_;
  auVar204 = vsubps_avx(_local_438,(undefined1  [16])aVar5);
  auVar154 = vshufps_avx(auVar204,auVar204,0xaa);
  auVar81 = vmovshdup_avx(auVar204);
  auVar204 = vmovsldup_avx(auVar204);
  auVar170._0_8_ =
       CONCAT44(auVar81._4_4_ * fVar216 + auVar154._4_4_ * fVar218 + fVar200 * auVar204._4_4_,
                auVar81._0_4_ * fVar163 + auVar154._0_4_ * fVar165 + fVar135 * auVar204._0_4_);
  auVar170._8_4_ = auVar81._8_4_ * fVar164 + auVar154._8_4_ * fVar166 + fVar162 * auVar204._8_4_;
  auVar170._12_4_ = auVar81._12_4_ * fVar217 + auVar154._12_4_ * fVar219 + fVar215 * auVar204._12_4_
  ;
  auVar204 = vsubps_avx(_local_418,(undefined1  [16])aVar5);
  auVar154 = vshufps_avx(auVar204,auVar204,0xaa);
  auVar81 = vmovshdup_avx(auVar204);
  auVar204 = vmovsldup_avx(auVar204);
  auVar319._0_8_ =
       CONCAT44(auVar204._4_4_ * fVar200 + auVar81._4_4_ * fVar216 + auVar154._4_4_ * fVar218,
                auVar204._0_4_ * fVar135 + auVar81._0_4_ * fVar163 + auVar154._0_4_ * fVar165);
  auVar319._8_4_ = auVar204._8_4_ * fVar162 + auVar81._8_4_ * fVar164 + auVar154._8_4_ * fVar166;
  auVar319._12_4_ = auVar204._12_4_ * fVar215 + auVar81._12_4_ * fVar217 + auVar154._12_4_ * fVar219
  ;
  auVar204 = vsubps_avx(_local_408,(undefined1  [16])aVar5);
  auVar154 = vshufps_avx(auVar204,auVar204,0xaa);
  auVar81 = vmovshdup_avx(auVar204);
  auVar204 = vmovsldup_avx(auVar204);
  auVar284._0_8_ =
       CONCAT44(auVar204._4_4_ * fVar200 + auVar81._4_4_ * fVar216 + auVar154._4_4_ * fVar218,
                auVar204._0_4_ * fVar135 + auVar81._0_4_ * fVar163 + auVar154._0_4_ * fVar165);
  auVar284._8_4_ = auVar204._8_4_ * fVar162 + auVar81._8_4_ * fVar164 + auVar154._8_4_ * fVar166;
  auVar284._12_4_ = auVar204._12_4_ * fVar215 + auVar81._12_4_ * fVar217 + auVar154._12_4_ * fVar219
  ;
  local_448._0_4_ = (float)local_408._0_4_ + (fVar233 + auVar205._0_4_) * 0.33333334;
  local_448._4_4_ = (float)local_408._4_4_ + (fVar234 + auVar205._4_4_) * 0.33333334;
  fStack_440 = fStack_400 + (fVar235 + auVar205._8_4_) * 0.33333334;
  fStack_43c = fStack_3fc + (fVar237 + auVar205._12_4_) * 0.33333334;
  auVar204 = vsubps_avx(_local_448,(undefined1  [16])aVar5);
  auVar154 = vshufps_avx(auVar204,auVar204,0xaa);
  auVar81 = vmovshdup_avx(auVar204);
  auVar204 = vmovsldup_avx(auVar204);
  auVar107._0_8_ =
       CONCAT44(auVar204._4_4_ * fVar200 + auVar81._4_4_ * fVar216 + auVar154._4_4_ * fVar218,
                auVar204._0_4_ * fVar135 + auVar81._0_4_ * fVar163 + auVar154._0_4_ * fVar165);
  auVar107._8_4_ = auVar204._8_4_ * fVar162 + auVar81._8_4_ * fVar164 + auVar154._8_4_ * fVar166;
  auVar107._12_4_ = auVar204._12_4_ * fVar215 + auVar81._12_4_ * fVar217 + auVar154._12_4_ * fVar219
  ;
  auVar241._0_4_ = (fVar167 + auVar74._0_4_) * 0.33333334;
  auVar241._4_4_ = (fVar220 + auVar74._4_4_) * 0.33333334;
  auVar241._8_4_ = (fVar221 + auVar74._8_4_) * 0.33333334;
  auVar241._12_4_ = (fVar232 + auVar74._12_4_) * 0.33333334;
  auVar63._4_4_ = fStack_474;
  auVar63._0_4_ = local_478;
  auVar63._8_4_ = fStack_470;
  auVar63._12_4_ = fStack_46c;
  _local_2e8 = vsubps_avx(auVar63,auVar241);
  auVar204 = vsubps_avx(_local_2e8,(undefined1  [16])aVar5);
  auVar154 = vshufps_avx(auVar204,auVar204,0xaa);
  auVar81 = vmovshdup_avx(auVar204);
  auVar204 = vmovsldup_avx(auVar204);
  auVar242._0_8_ =
       CONCAT44(auVar81._4_4_ * fVar216 + auVar154._4_4_ * fVar218 + fVar200 * auVar204._4_4_,
                auVar81._0_4_ * fVar163 + auVar154._0_4_ * fVar165 + fVar135 * auVar204._0_4_);
  auVar242._8_4_ = auVar81._8_4_ * fVar164 + auVar154._8_4_ * fVar166 + fVar162 * auVar204._8_4_;
  auVar242._12_4_ = auVar81._12_4_ * fVar217 + auVar154._12_4_ * fVar219 + fVar215 * auVar204._12_4_
  ;
  auVar204 = vsubps_avx(auVar63,(undefined1  [16])aVar5);
  auVar154 = vshufps_avx(auVar204,auVar204,0xaa);
  auVar81 = vmovshdup_avx(auVar204);
  auVar204 = vmovsldup_avx(auVar204);
  auVar76._0_8_ =
       CONCAT44(fVar200 * auVar204._4_4_ + auVar81._4_4_ * fVar216 + auVar154._4_4_ * fVar218,
                fVar135 * auVar204._0_4_ + auVar81._0_4_ * fVar163 + auVar154._0_4_ * fVar165);
  auVar76._8_4_ = fVar162 * auVar204._8_4_ + auVar81._8_4_ * fVar164 + auVar154._8_4_ * fVar166;
  auVar76._12_4_ = fVar215 * auVar204._12_4_ + auVar81._12_4_ * fVar217 + auVar154._12_4_ * fVar219;
  _local_328 = vmovlhps_avx(_local_4f8,auVar284);
  _local_338 = vmovlhps_avx(_local_4c8,auVar107);
  _local_348 = vmovlhps_avx(auVar170,auVar242);
  _local_218 = vmovlhps_avx(auVar319,auVar76);
  auVar81 = vminps_avx(_local_328,_local_338);
  auVar204 = vminps_avx(_local_348,_local_218);
  auVar154 = vminps_avx(auVar81,auVar204);
  auVar81 = vmaxps_avx(_local_328,_local_338);
  auVar204 = vmaxps_avx(_local_348,_local_218);
  auVar81 = vmaxps_avx(auVar81,auVar204);
  auVar204 = vshufpd_avx(auVar154,auVar154,3);
  auVar154 = vminps_avx(auVar154,auVar204);
  auVar204 = vshufpd_avx(auVar81,auVar81,3);
  auVar204 = vmaxps_avx(auVar81,auVar204);
  auVar227._8_4_ = 0x7fffffff;
  auVar227._0_8_ = 0x7fffffff7fffffff;
  auVar227._12_4_ = 0x7fffffff;
  auVar81 = vandps_avx(auVar154,auVar227);
  auVar204 = vandps_avx(auVar204,auVar227);
  auVar81 = vmaxps_avx(auVar81,auVar204);
  auVar204 = vmovshdup_avx(auVar81);
  auVar81 = vmaxss_avx(auVar204,auVar81);
  fVar135 = auVar81._0_4_ * 9.536743e-07;
  local_378._8_8_ = local_4f8;
  local_378._0_8_ = local_4f8;
  auVar231 = ZEXT1664(local_378);
  local_388._8_8_ = local_4c8;
  local_388._0_8_ = local_4c8;
  local_398._8_8_ = auVar170._0_8_;
  local_398._0_8_ = auVar170._0_8_;
  auVar262 = ZEXT1664(local_398);
  local_3a8._8_8_ = auVar319._0_8_;
  local_3a8._0_8_ = auVar319._0_8_;
  local_3b8._8_8_ = auVar284._0_8_;
  local_3b8._0_8_ = auVar284._0_8_;
  auVar291 = ZEXT1664(local_3b8);
  local_3c8._8_8_ = auVar107._0_8_;
  local_3c8._0_8_ = auVar107._0_8_;
  local_3d8._8_8_ = auVar242._0_8_;
  local_3d8._0_8_ = auVar242._0_8_;
  auVar250 = ZEXT1664(local_388);
  local_3e8._8_8_ = auVar76._0_8_;
  local_3e8._0_8_ = auVar76._0_8_;
  local_228 = ZEXT416((uint)fVar135);
  auVar81 = vshufps_avx(ZEXT416((uint)fVar135),ZEXT416((uint)fVar135),0);
  local_78._16_16_ = auVar81;
  local_78._0_16_ = auVar81;
  auVar77._0_8_ = auVar81._0_8_ ^ 0x8000000080000000;
  auVar77._8_4_ = auVar81._8_4_ ^ 0x80000000;
  auVar77._12_4_ = auVar81._12_4_ ^ 0x80000000;
  local_98._16_16_ = auVar77;
  local_98._0_16_ = auVar77;
  uVar71 = 0;
  _local_1e8 = vsubps_avx(_local_338,_local_328);
  auVar300 = ZEXT1664(local_3c8);
  _local_1f8 = vsubps_avx(_local_348,_local_338);
  auVar306 = ZEXT1664(local_3d8);
  auVar317 = ZEXT1664(local_3e8);
  _local_208 = vsubps_avx(_local_218,_local_348);
  _local_248 = vsubps_avx(_local_408,_local_3f8);
  _local_258 = vsubps_avx(_local_448,_local_428);
  auVar274 = ZEXT1664(local_3a8);
  _local_268 = vsubps_avx(_local_2e8,_local_438);
  auVar64._4_4_ = fStack_474;
  auVar64._0_4_ = local_478;
  auVar64._8_4_ = fStack_470;
  auVar64._12_4_ = fStack_46c;
  _local_278 = vsubps_avx(auVar64,_local_418);
  auVar327 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar330 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_009c205e:
  do {
    local_238 = auVar330._0_16_;
    auVar255 = auVar327._0_16_;
    auVar81 = vshufps_avx(auVar255,auVar255,0x50);
    auVar320._8_4_ = 0x3f800000;
    auVar320._0_8_ = 0x3f8000003f800000;
    auVar320._12_4_ = 0x3f800000;
    auVar326._16_4_ = 0x3f800000;
    auVar326._0_16_ = auVar320;
    auVar326._20_4_ = 0x3f800000;
    auVar326._24_4_ = 0x3f800000;
    auVar326._28_4_ = 0x3f800000;
    auVar204 = vsubps_avx(auVar320,auVar81);
    fVar135 = auVar81._0_4_;
    fVar200 = auVar81._4_4_;
    fVar162 = auVar81._8_4_;
    fVar215 = auVar81._12_4_;
    fVar163 = auVar204._0_4_;
    fVar216 = auVar204._4_4_;
    fVar164 = auVar204._8_4_;
    fVar217 = auVar204._12_4_;
    auVar171._0_4_ = auVar291._0_4_ * fVar135 + fVar163 * auVar231._0_4_;
    auVar171._4_4_ = auVar291._4_4_ * fVar200 + fVar216 * auVar231._4_4_;
    auVar171._8_4_ = auVar291._8_4_ * fVar162 + fVar164 * auVar231._8_4_;
    auVar171._12_4_ = auVar291._12_4_ * fVar215 + fVar217 * auVar231._12_4_;
    auVar137._0_4_ = auVar300._0_4_ * fVar135 + fVar163 * auVar250._0_4_;
    auVar137._4_4_ = auVar300._4_4_ * fVar200 + fVar216 * auVar250._4_4_;
    auVar137._8_4_ = auVar300._8_4_ * fVar162 + fVar164 * auVar250._8_4_;
    auVar137._12_4_ = auVar300._12_4_ * fVar215 + fVar217 * auVar250._12_4_;
    auVar243._0_4_ = auVar306._0_4_ * fVar135 + auVar262._0_4_ * fVar163;
    auVar243._4_4_ = auVar306._4_4_ * fVar200 + auVar262._4_4_ * fVar216;
    auVar243._8_4_ = auVar306._8_4_ * fVar162 + auVar262._8_4_ * fVar164;
    auVar243._12_4_ = auVar306._12_4_ * fVar215 + auVar262._12_4_ * fVar217;
    auVar184._0_4_ = auVar317._0_4_ * fVar135 + auVar274._0_4_ * fVar163;
    auVar184._4_4_ = auVar317._4_4_ * fVar200 + auVar274._4_4_ * fVar216;
    auVar184._8_4_ = auVar317._8_4_ * fVar162 + auVar274._8_4_ * fVar164;
    auVar184._12_4_ = auVar317._12_4_ * fVar215 + auVar274._12_4_ * fVar217;
    auVar81 = vmovshdup_avx(local_238);
    auVar204 = vshufps_avx(local_238,local_238,0);
    auVar272._16_16_ = auVar204;
    auVar272._0_16_ = auVar204;
    auVar154 = vshufps_avx(local_238,local_238,0x55);
    auVar97._16_16_ = auVar154;
    auVar97._0_16_ = auVar154;
    auVar92 = vsubps_avx(auVar97,auVar272);
    auVar154 = vshufps_avx(auVar171,auVar171,0);
    auVar122 = vshufps_avx(auVar171,auVar171,0x55);
    auVar110 = vshufps_avx(auVar137,auVar137,0);
    auVar140 = vshufps_avx(auVar137,auVar137,0x55);
    auVar111 = vshufps_avx(auVar243,auVar243,0);
    auVar236 = vshufps_avx(auVar243,auVar243,0x55);
    auVar6 = vshufps_avx(auVar184,auVar184,0);
    auVar7 = vshufps_avx(auVar184,auVar184,0x55);
    auVar81 = ZEXT416((uint)((auVar81._0_4_ - auVar330._0_4_) * 0.04761905));
    auVar81 = vshufps_avx(auVar81,auVar81,0);
    auVar290._0_4_ = auVar204._0_4_ + auVar92._0_4_ * 0.0;
    auVar290._4_4_ = auVar204._4_4_ + auVar92._4_4_ * 0.14285715;
    auVar290._8_4_ = auVar204._8_4_ + auVar92._8_4_ * 0.2857143;
    auVar290._12_4_ = auVar204._12_4_ + auVar92._12_4_ * 0.42857146;
    auVar290._16_4_ = auVar204._0_4_ + auVar92._16_4_ * 0.5714286;
    auVar290._20_4_ = auVar204._4_4_ + auVar92._20_4_ * 0.71428573;
    auVar290._24_4_ = auVar204._8_4_ + auVar92._24_4_ * 0.8571429;
    auVar290._28_4_ = auVar204._12_4_ + auVar92._28_4_;
    auVar15 = vsubps_avx(auVar326,auVar290);
    fVar135 = auVar110._0_4_;
    fVar162 = auVar110._4_4_;
    fVar163 = auVar110._8_4_;
    fVar164 = auVar110._12_4_;
    fVar266 = auVar15._0_4_;
    fVar275 = auVar15._4_4_;
    fVar276 = auVar15._8_4_;
    fVar277 = auVar15._12_4_;
    fVar278 = auVar15._16_4_;
    fVar279 = auVar15._20_4_;
    fVar280 = auVar15._24_4_;
    fVar238 = auVar140._0_4_;
    fVar263 = auVar140._4_4_;
    fVar264 = auVar140._8_4_;
    fVar265 = auVar140._12_4_;
    fVar318 = auVar122._12_4_ + 1.0;
    fVar233 = auVar111._0_4_;
    fVar234 = auVar111._4_4_;
    fVar235 = auVar111._8_4_;
    fVar237 = auVar111._12_4_;
    fVar165 = fVar233 * auVar290._0_4_ + fVar266 * fVar135;
    fVar218 = fVar234 * auVar290._4_4_ + fVar275 * fVar162;
    fVar166 = fVar235 * auVar290._8_4_ + fVar276 * fVar163;
    fVar219 = fVar237 * auVar290._12_4_ + fVar277 * fVar164;
    fVar167 = fVar233 * auVar290._16_4_ + fVar278 * fVar135;
    fVar220 = fVar234 * auVar290._20_4_ + fVar279 * fVar162;
    fVar221 = fVar235 * auVar290._24_4_ + fVar280 * fVar163;
    fVar200 = auVar236._0_4_;
    fVar215 = auVar236._4_4_;
    fVar216 = auVar236._8_4_;
    fVar217 = auVar236._12_4_;
    fVar301 = fVar238 * fVar266 + auVar290._0_4_ * fVar200;
    fVar307 = fVar263 * fVar275 + auVar290._4_4_ * fVar215;
    fVar308 = fVar264 * fVar276 + auVar290._8_4_ * fVar216;
    fVar309 = fVar265 * fVar277 + auVar290._12_4_ * fVar217;
    fVar310 = fVar238 * fVar278 + auVar290._16_4_ * fVar200;
    fVar311 = fVar263 * fVar279 + auVar290._20_4_ * fVar215;
    fVar312 = fVar264 * fVar280 + auVar290._24_4_ * fVar216;
    fVar313 = fVar265 + fVar164;
    auVar204 = vshufps_avx(auVar171,auVar171,0xaa);
    auVar110 = vshufps_avx(auVar171,auVar171,0xff);
    fVar232 = fVar237 + 0.0;
    auVar140 = vshufps_avx(auVar137,auVar137,0xaa);
    auVar111 = vshufps_avx(auVar137,auVar137,0xff);
    auVar198._0_4_ =
         fVar266 * (auVar290._0_4_ * fVar135 + fVar266 * auVar154._0_4_) + auVar290._0_4_ * fVar165;
    auVar198._4_4_ =
         fVar275 * (auVar290._4_4_ * fVar162 + fVar275 * auVar154._4_4_) + auVar290._4_4_ * fVar218;
    auVar198._8_4_ =
         fVar276 * (auVar290._8_4_ * fVar163 + fVar276 * auVar154._8_4_) + auVar290._8_4_ * fVar166;
    auVar198._12_4_ =
         fVar277 * (auVar290._12_4_ * fVar164 + fVar277 * auVar154._12_4_) +
         auVar290._12_4_ * fVar219;
    auVar198._16_4_ =
         fVar278 * (auVar290._16_4_ * fVar135 + fVar278 * auVar154._0_4_) +
         auVar290._16_4_ * fVar167;
    auVar198._20_4_ =
         fVar279 * (auVar290._20_4_ * fVar162 + fVar279 * auVar154._4_4_) +
         auVar290._20_4_ * fVar220;
    auVar198._24_4_ =
         fVar280 * (auVar290._24_4_ * fVar163 + fVar280 * auVar154._8_4_) +
         auVar290._24_4_ * fVar221;
    auVar198._28_4_ = auVar154._12_4_ + 1.0 + fVar217;
    auVar213._0_4_ =
         fVar266 * (fVar238 * auVar290._0_4_ + auVar122._0_4_ * fVar266) + auVar290._0_4_ * fVar301;
    auVar213._4_4_ =
         fVar275 * (fVar263 * auVar290._4_4_ + auVar122._4_4_ * fVar275) + auVar290._4_4_ * fVar307;
    auVar213._8_4_ =
         fVar276 * (fVar264 * auVar290._8_4_ + auVar122._8_4_ * fVar276) + auVar290._8_4_ * fVar308;
    auVar213._12_4_ =
         fVar277 * (fVar265 * auVar290._12_4_ + auVar122._12_4_ * fVar277) +
         auVar290._12_4_ * fVar309;
    auVar213._16_4_ =
         fVar278 * (fVar238 * auVar290._16_4_ + auVar122._0_4_ * fVar278) +
         auVar290._16_4_ * fVar310;
    auVar213._20_4_ =
         fVar279 * (fVar263 * auVar290._20_4_ + auVar122._4_4_ * fVar279) +
         auVar290._20_4_ * fVar311;
    auVar213._24_4_ =
         fVar280 * (fVar264 * auVar290._24_4_ + auVar122._8_4_ * fVar280) +
         auVar290._24_4_ * fVar312;
    auVar213._28_4_ = auVar7._12_4_ + fVar217;
    auVar98._0_4_ =
         fVar266 * fVar165 + auVar290._0_4_ * (fVar233 * fVar266 + auVar6._0_4_ * auVar290._0_4_);
    auVar98._4_4_ =
         fVar275 * fVar218 + auVar290._4_4_ * (fVar234 * fVar275 + auVar6._4_4_ * auVar290._4_4_);
    auVar98._8_4_ =
         fVar276 * fVar166 + auVar290._8_4_ * (fVar235 * fVar276 + auVar6._8_4_ * auVar290._8_4_);
    auVar98._12_4_ =
         fVar277 * fVar219 + auVar290._12_4_ * (fVar237 * fVar277 + auVar6._12_4_ * auVar290._12_4_)
    ;
    auVar98._16_4_ =
         fVar278 * fVar167 + auVar290._16_4_ * (fVar233 * fVar278 + auVar6._0_4_ * auVar290._16_4_);
    auVar98._20_4_ =
         fVar279 * fVar220 + auVar290._20_4_ * (fVar234 * fVar279 + auVar6._4_4_ * auVar290._20_4_);
    auVar98._24_4_ =
         fVar280 * fVar221 + auVar290._24_4_ * (fVar235 * fVar280 + auVar6._8_4_ * auVar290._24_4_);
    auVar98._28_4_ = fVar164 + 1.0 + fVar232;
    auVar299._0_4_ =
         fVar266 * fVar301 + auVar290._0_4_ * (auVar7._0_4_ * auVar290._0_4_ + fVar266 * fVar200);
    auVar299._4_4_ =
         fVar275 * fVar307 + auVar290._4_4_ * (auVar7._4_4_ * auVar290._4_4_ + fVar275 * fVar215);
    auVar299._8_4_ =
         fVar276 * fVar308 + auVar290._8_4_ * (auVar7._8_4_ * auVar290._8_4_ + fVar276 * fVar216);
    auVar299._12_4_ =
         fVar277 * fVar309 + auVar290._12_4_ * (auVar7._12_4_ * auVar290._12_4_ + fVar277 * fVar217)
    ;
    auVar299._16_4_ =
         fVar278 * fVar310 + auVar290._16_4_ * (auVar7._0_4_ * auVar290._16_4_ + fVar278 * fVar200);
    auVar299._20_4_ =
         fVar279 * fVar311 + auVar290._20_4_ * (auVar7._4_4_ * auVar290._20_4_ + fVar279 * fVar215);
    auVar299._24_4_ =
         fVar280 * fVar312 + auVar290._24_4_ * (auVar7._8_4_ * auVar290._24_4_ + fVar280 * fVar216);
    auVar299._28_4_ = fVar232 + fVar217 + 0.0;
    local_d8._0_4_ = fVar266 * auVar198._0_4_ + auVar290._0_4_ * auVar98._0_4_;
    local_d8._4_4_ = fVar275 * auVar198._4_4_ + auVar290._4_4_ * auVar98._4_4_;
    local_d8._8_4_ = fVar276 * auVar198._8_4_ + auVar290._8_4_ * auVar98._8_4_;
    local_d8._12_4_ = fVar277 * auVar198._12_4_ + auVar290._12_4_ * auVar98._12_4_;
    local_d8._16_4_ = fVar278 * auVar198._16_4_ + auVar290._16_4_ * auVar98._16_4_;
    local_d8._20_4_ = fVar279 * auVar198._20_4_ + auVar290._20_4_ * auVar98._20_4_;
    local_d8._24_4_ = fVar280 * auVar198._24_4_ + auVar290._24_4_ * auVar98._24_4_;
    local_d8._28_4_ = fVar313 + fVar217 + 0.0;
    auVar178._0_4_ = fVar266 * auVar213._0_4_ + auVar290._0_4_ * auVar299._0_4_;
    auVar178._4_4_ = fVar275 * auVar213._4_4_ + auVar290._4_4_ * auVar299._4_4_;
    auVar178._8_4_ = fVar276 * auVar213._8_4_ + auVar290._8_4_ * auVar299._8_4_;
    auVar178._12_4_ = fVar277 * auVar213._12_4_ + auVar290._12_4_ * auVar299._12_4_;
    auVar178._16_4_ = fVar278 * auVar213._16_4_ + auVar290._16_4_ * auVar299._16_4_;
    auVar178._20_4_ = fVar279 * auVar213._20_4_ + auVar290._20_4_ * auVar299._20_4_;
    auVar178._24_4_ = fVar280 * auVar213._24_4_ + auVar290._24_4_ * auVar299._24_4_;
    auVar178._28_4_ = fVar313 + fVar232;
    auVar16 = vsubps_avx(auVar98,auVar198);
    auVar92 = vsubps_avx(auVar299,auVar213);
    local_368._0_4_ = auVar81._0_4_;
    local_368._4_4_ = auVar81._4_4_;
    fStack_360 = auVar81._8_4_;
    fStack_35c = auVar81._12_4_;
    local_118 = (float)local_368._0_4_ * auVar16._0_4_ * 3.0;
    fStack_114 = (float)local_368._4_4_ * auVar16._4_4_ * 3.0;
    auVar25._4_4_ = fStack_114;
    auVar25._0_4_ = local_118;
    fStack_110 = fStack_360 * auVar16._8_4_ * 3.0;
    auVar25._8_4_ = fStack_110;
    fStack_10c = fStack_35c * auVar16._12_4_ * 3.0;
    auVar25._12_4_ = fStack_10c;
    fStack_108 = (float)local_368._0_4_ * auVar16._16_4_ * 3.0;
    auVar25._16_4_ = fStack_108;
    fStack_104 = (float)local_368._4_4_ * auVar16._20_4_ * 3.0;
    auVar25._20_4_ = fStack_104;
    fStack_100 = fStack_360 * auVar16._24_4_ * 3.0;
    auVar25._24_4_ = fStack_100;
    auVar25._28_4_ = auVar16._28_4_;
    local_138 = (float)local_368._0_4_ * auVar92._0_4_ * 3.0;
    fStack_134 = (float)local_368._4_4_ * auVar92._4_4_ * 3.0;
    auVar26._4_4_ = fStack_134;
    auVar26._0_4_ = local_138;
    fStack_130 = fStack_360 * auVar92._8_4_ * 3.0;
    auVar26._8_4_ = fStack_130;
    fStack_12c = fStack_35c * auVar92._12_4_ * 3.0;
    auVar26._12_4_ = fStack_12c;
    fStack_128 = (float)local_368._0_4_ * auVar92._16_4_ * 3.0;
    auVar26._16_4_ = fStack_128;
    fStack_124 = (float)local_368._4_4_ * auVar92._20_4_ * 3.0;
    auVar26._20_4_ = fStack_124;
    fStack_120 = fStack_360 * auVar92._24_4_ * 3.0;
    auVar26._24_4_ = fStack_120;
    auVar26._28_4_ = fVar313;
    auVar17 = vsubps_avx(local_d8,auVar25);
    auVar92 = vperm2f128_avx(auVar17,auVar17,1);
    auVar92 = vshufps_avx(auVar92,auVar17,0x30);
    _local_4c8 = vshufps_avx(auVar17,auVar92,0x29);
    auVar17 = vsubps_avx(auVar178,auVar26);
    auVar92 = vperm2f128_avx(auVar17,auVar17,1);
    auVar92 = vshufps_avx(auVar92,auVar17,0x30);
    _local_468 = vshufps_avx(auVar17,auVar92,0x29);
    auVar95 = _local_468;
    fVar311 = auVar140._0_4_;
    fVar312 = auVar140._4_4_;
    fVar331 = auVar140._8_4_;
    fVar164 = auVar204._12_4_;
    fVar234 = auVar111._0_4_;
    fVar237 = auVar111._4_4_;
    fVar301 = auVar111._8_4_;
    fVar307 = auVar111._12_4_;
    auVar81 = vshufps_avx(auVar243,auVar243,0xaa);
    fVar135 = auVar81._0_4_;
    fVar162 = auVar81._4_4_;
    fVar163 = auVar81._8_4_;
    fVar217 = auVar81._12_4_;
    fVar166 = auVar290._0_4_ * fVar135 + fVar311 * fVar266;
    fVar219 = auVar290._4_4_ * fVar162 + fVar312 * fVar275;
    fVar167 = auVar290._8_4_ * fVar163 + fVar331 * fVar276;
    fVar220 = auVar290._12_4_ * fVar217 + auVar140._12_4_ * fVar277;
    fVar221 = auVar290._16_4_ * fVar135 + fVar311 * fVar278;
    fVar232 = auVar290._20_4_ * fVar162 + fVar312 * fVar279;
    fVar233 = auVar290._24_4_ * fVar163 + fVar331 * fVar280;
    auVar81 = vshufps_avx(auVar243,auVar243,0xff);
    fVar200 = auVar81._0_4_;
    fVar215 = auVar81._4_4_;
    fVar216 = auVar81._8_4_;
    fVar165 = auVar81._12_4_;
    fVar235 = auVar290._0_4_ * fVar200 + fVar234 * fVar266;
    fVar238 = auVar290._4_4_ * fVar215 + fVar237 * fVar275;
    fVar263 = auVar290._8_4_ * fVar216 + fVar301 * fVar276;
    fVar264 = auVar290._12_4_ * fVar165 + fVar307 * fVar277;
    fVar308 = auVar290._16_4_ * fVar200 + fVar234 * fVar278;
    fVar265 = auVar290._20_4_ * fVar215 + fVar237 * fVar279;
    fVar309 = auVar290._24_4_ * fVar216 + fVar301 * fVar280;
    auVar81 = vshufps_avx(auVar184,auVar184,0xaa);
    fVar310 = auVar81._12_4_ + fVar217;
    auVar154 = vshufps_avx(auVar184,auVar184,0xff);
    fVar218 = auVar154._12_4_;
    auVar99._0_4_ =
         fVar266 * (fVar311 * auVar290._0_4_ + fVar266 * auVar204._0_4_) + auVar290._0_4_ * fVar166;
    auVar99._4_4_ =
         fVar275 * (fVar312 * auVar290._4_4_ + fVar275 * auVar204._4_4_) + auVar290._4_4_ * fVar219;
    auVar99._8_4_ =
         fVar276 * (fVar331 * auVar290._8_4_ + fVar276 * auVar204._8_4_) + auVar290._8_4_ * fVar167;
    auVar99._12_4_ =
         fVar277 * (auVar140._12_4_ * auVar290._12_4_ + fVar277 * fVar164) +
         auVar290._12_4_ * fVar220;
    auVar99._16_4_ =
         fVar278 * (fVar311 * auVar290._16_4_ + fVar278 * auVar204._0_4_) +
         auVar290._16_4_ * fVar221;
    auVar99._20_4_ =
         fVar279 * (fVar312 * auVar290._20_4_ + fVar279 * auVar204._4_4_) +
         auVar290._20_4_ * fVar232;
    auVar99._24_4_ =
         fVar280 * (fVar331 * auVar290._24_4_ + fVar280 * auVar204._8_4_) +
         auVar290._24_4_ * fVar233;
    auVar99._28_4_ = local_468._28_4_ + fVar164 + fVar218;
    auVar131._0_4_ =
         fVar266 * (fVar234 * auVar290._0_4_ + auVar110._0_4_ * fVar266) + auVar290._0_4_ * fVar235;
    auVar131._4_4_ =
         fVar275 * (fVar237 * auVar290._4_4_ + auVar110._4_4_ * fVar275) + auVar290._4_4_ * fVar238;
    auVar131._8_4_ =
         fVar276 * (fVar301 * auVar290._8_4_ + auVar110._8_4_ * fVar276) + auVar290._8_4_ * fVar263;
    auVar131._12_4_ =
         fVar277 * (fVar307 * auVar290._12_4_ + auVar110._12_4_ * fVar277) +
         auVar290._12_4_ * fVar264;
    auVar131._16_4_ =
         fVar278 * (fVar234 * auVar290._16_4_ + auVar110._0_4_ * fVar278) +
         auVar290._16_4_ * fVar308;
    auVar131._20_4_ =
         fVar279 * (fVar237 * auVar290._20_4_ + auVar110._4_4_ * fVar279) +
         auVar290._20_4_ * fVar265;
    auVar131._24_4_ =
         fVar280 * (fVar301 * auVar290._24_4_ + auVar110._8_4_ * fVar280) +
         auVar290._24_4_ * fVar309;
    auVar131._28_4_ = fVar164 + auVar92._28_4_ + fVar218;
    auVar92 = vperm2f128_avx(local_d8,local_d8,1);
    auVar92 = vshufps_avx(auVar92,local_d8,0x30);
    _local_2d8 = vshufps_avx(local_d8,auVar92,0x29);
    auVar214._0_4_ =
         auVar290._0_4_ * (auVar81._0_4_ * auVar290._0_4_ + fVar266 * fVar135) + fVar266 * fVar166;
    auVar214._4_4_ =
         auVar290._4_4_ * (auVar81._4_4_ * auVar290._4_4_ + fVar275 * fVar162) + fVar275 * fVar219;
    auVar214._8_4_ =
         auVar290._8_4_ * (auVar81._8_4_ * auVar290._8_4_ + fVar276 * fVar163) + fVar276 * fVar167;
    auVar214._12_4_ =
         auVar290._12_4_ * (auVar81._12_4_ * auVar290._12_4_ + fVar277 * fVar217) +
         fVar277 * fVar220;
    auVar214._16_4_ =
         auVar290._16_4_ * (auVar81._0_4_ * auVar290._16_4_ + fVar278 * fVar135) + fVar278 * fVar221
    ;
    auVar214._20_4_ =
         auVar290._20_4_ * (auVar81._4_4_ * auVar290._20_4_ + fVar279 * fVar162) + fVar279 * fVar232
    ;
    auVar214._24_4_ =
         auVar290._24_4_ * (auVar81._8_4_ * auVar290._24_4_ + fVar280 * fVar163) + fVar280 * fVar233
    ;
    auVar214._28_4_ = fVar310 + fVar318 + auVar213._28_4_;
    auVar261._0_4_ =
         fVar266 * fVar235 + auVar290._0_4_ * (auVar290._0_4_ * auVar154._0_4_ + fVar266 * fVar200);
    auVar261._4_4_ =
         fVar275 * fVar238 + auVar290._4_4_ * (auVar290._4_4_ * auVar154._4_4_ + fVar275 * fVar215);
    auVar261._8_4_ =
         fVar276 * fVar263 + auVar290._8_4_ * (auVar290._8_4_ * auVar154._8_4_ + fVar276 * fVar216);
    auVar261._12_4_ =
         fVar277 * fVar264 + auVar290._12_4_ * (auVar290._12_4_ * fVar218 + fVar277 * fVar165);
    auVar261._16_4_ =
         fVar278 * fVar308 +
         auVar290._16_4_ * (auVar290._16_4_ * auVar154._0_4_ + fVar278 * fVar200);
    auVar261._20_4_ =
         fVar279 * fVar265 +
         auVar290._20_4_ * (auVar290._20_4_ * auVar154._4_4_ + fVar279 * fVar215);
    auVar261._24_4_ =
         fVar280 * fVar309 +
         auVar290._24_4_ * (auVar290._24_4_ * auVar154._8_4_ + fVar280 * fVar216);
    auVar261._28_4_ = fVar318 + fVar307 + fVar218 + fVar165;
    auVar249._0_4_ = fVar266 * auVar99._0_4_ + auVar290._0_4_ * auVar214._0_4_;
    auVar249._4_4_ = fVar275 * auVar99._4_4_ + auVar290._4_4_ * auVar214._4_4_;
    auVar249._8_4_ = fVar276 * auVar99._8_4_ + auVar290._8_4_ * auVar214._8_4_;
    auVar249._12_4_ = fVar277 * auVar99._12_4_ + auVar290._12_4_ * auVar214._12_4_;
    auVar249._16_4_ = fVar278 * auVar99._16_4_ + auVar290._16_4_ * auVar214._16_4_;
    auVar249._20_4_ = fVar279 * auVar99._20_4_ + auVar290._20_4_ * auVar214._20_4_;
    auVar249._24_4_ = fVar280 * auVar99._24_4_ + auVar290._24_4_ * auVar214._24_4_;
    auVar249._28_4_ = fVar310 + fVar218 + fVar165;
    auVar273._0_4_ = fVar266 * auVar131._0_4_ + auVar290._0_4_ * auVar261._0_4_;
    auVar273._4_4_ = fVar275 * auVar131._4_4_ + auVar290._4_4_ * auVar261._4_4_;
    auVar273._8_4_ = fVar276 * auVar131._8_4_ + auVar290._8_4_ * auVar261._8_4_;
    auVar273._12_4_ = fVar277 * auVar131._12_4_ + auVar290._12_4_ * auVar261._12_4_;
    auVar273._16_4_ = fVar278 * auVar131._16_4_ + auVar290._16_4_ * auVar261._16_4_;
    auVar273._20_4_ = fVar279 * auVar131._20_4_ + auVar290._20_4_ * auVar261._20_4_;
    auVar273._24_4_ = fVar280 * auVar131._24_4_ + auVar290._24_4_ * auVar261._24_4_;
    auVar273._28_4_ = auVar15._28_4_ + auVar290._28_4_;
    auVar15 = vsubps_avx(auVar214,auVar99);
    auVar92 = vsubps_avx(auVar261,auVar131);
    local_158 = (float)local_368._0_4_ * auVar15._0_4_ * 3.0;
    fStack_154 = (float)local_368._4_4_ * auVar15._4_4_ * 3.0;
    auVar27._4_4_ = fStack_154;
    auVar27._0_4_ = local_158;
    fStack_150 = fStack_360 * auVar15._8_4_ * 3.0;
    auVar27._8_4_ = fStack_150;
    fStack_14c = fStack_35c * auVar15._12_4_ * 3.0;
    auVar27._12_4_ = fStack_14c;
    fStack_148 = (float)local_368._0_4_ * auVar15._16_4_ * 3.0;
    auVar27._16_4_ = fStack_148;
    fStack_144 = (float)local_368._4_4_ * auVar15._20_4_ * 3.0;
    auVar27._20_4_ = fStack_144;
    fStack_140 = fStack_360 * auVar15._24_4_ * 3.0;
    auVar27._24_4_ = fStack_140;
    auVar27._28_4_ = auVar15._28_4_;
    local_178 = (float)local_368._0_4_ * auVar92._0_4_ * 3.0;
    fStack_174 = (float)local_368._4_4_ * auVar92._4_4_ * 3.0;
    auVar28._4_4_ = fStack_174;
    auVar28._0_4_ = local_178;
    fStack_170 = fStack_360 * auVar92._8_4_ * 3.0;
    auVar28._8_4_ = fStack_170;
    fStack_16c = fStack_35c * auVar92._12_4_ * 3.0;
    auVar28._12_4_ = fStack_16c;
    fStack_168 = (float)local_368._0_4_ * auVar92._16_4_ * 3.0;
    auVar28._16_4_ = fStack_168;
    fStack_164 = (float)local_368._4_4_ * auVar92._20_4_ * 3.0;
    auVar28._20_4_ = fStack_164;
    fStack_160 = fStack_360 * auVar92._24_4_ * 3.0;
    auVar28._24_4_ = fStack_160;
    auVar28._28_4_ = auVar214._28_4_;
    auVar92 = vperm2f128_avx(auVar249,auVar249,1);
    auVar92 = vshufps_avx(auVar92,auVar249,0x30);
    auVar19 = vshufps_avx(auVar249,auVar92,0x29);
    auVar17 = vsubps_avx(auVar249,auVar27);
    auVar92 = vperm2f128_avx(auVar17,auVar17,1);
    auVar92 = vshufps_avx(auVar92,auVar17,0x30);
    _local_368 = vshufps_avx(auVar17,auVar92,0x29);
    auVar96 = _local_368;
    auVar17 = vsubps_avx(auVar273,auVar28);
    auVar92 = vperm2f128_avx(auVar17,auVar17,1);
    auVar92 = vshufps_avx(auVar92,auVar17,0x30);
    local_b8 = vshufps_avx(auVar17,auVar92,0x29);
    auVar17 = vsubps_avx(auVar249,local_d8);
    auVar18 = vsubps_avx(auVar19,_local_2d8);
    fVar135 = auVar18._0_4_ + auVar17._0_4_;
    fVar200 = auVar18._4_4_ + auVar17._4_4_;
    fVar162 = auVar18._8_4_ + auVar17._8_4_;
    fVar215 = auVar18._12_4_ + auVar17._12_4_;
    fVar163 = auVar18._16_4_ + auVar17._16_4_;
    fVar216 = auVar18._20_4_ + auVar17._20_4_;
    fVar164 = auVar18._24_4_ + auVar17._24_4_;
    auVar92 = vperm2f128_avx(auVar178,auVar178,1);
    auVar92 = vshufps_avx(auVar92,auVar178,0x30);
    local_f8 = vshufps_avx(auVar178,auVar92,0x29);
    auVar92 = vperm2f128_avx(auVar273,auVar273,1);
    auVar92 = vshufps_avx(auVar92,auVar273,0x30);
    _local_498 = vshufps_avx(auVar273,auVar92,0x29);
    auVar92 = vsubps_avx(auVar273,auVar178);
    auVar20 = vsubps_avx(_local_498,local_f8);
    fVar217 = auVar20._0_4_ + auVar92._0_4_;
    fVar165 = auVar20._4_4_ + auVar92._4_4_;
    fVar218 = auVar20._8_4_ + auVar92._8_4_;
    fVar166 = auVar20._12_4_ + auVar92._12_4_;
    fVar219 = auVar20._16_4_ + auVar92._16_4_;
    fVar167 = auVar20._20_4_ + auVar92._20_4_;
    fVar220 = auVar20._24_4_ + auVar92._24_4_;
    auVar29._4_4_ = fVar200 * auVar178._4_4_;
    auVar29._0_4_ = fVar135 * auVar178._0_4_;
    auVar29._8_4_ = fVar162 * auVar178._8_4_;
    auVar29._12_4_ = fVar215 * auVar178._12_4_;
    auVar29._16_4_ = fVar163 * auVar178._16_4_;
    auVar29._20_4_ = fVar216 * auVar178._20_4_;
    auVar29._24_4_ = fVar164 * auVar178._24_4_;
    auVar29._28_4_ = auVar92._28_4_;
    auVar30._4_4_ = fVar165 * local_d8._4_4_;
    auVar30._0_4_ = fVar217 * local_d8._0_4_;
    auVar30._8_4_ = fVar218 * local_d8._8_4_;
    auVar30._12_4_ = fVar166 * local_d8._12_4_;
    auVar30._16_4_ = fVar219 * local_d8._16_4_;
    auVar30._20_4_ = fVar167 * local_d8._20_4_;
    auVar30._24_4_ = fVar220 * local_d8._24_4_;
    auVar30._28_4_ = fVar310;
    auVar21 = vsubps_avx(auVar29,auVar30);
    local_118 = local_d8._0_4_ + local_118;
    fStack_114 = local_d8._4_4_ + fStack_114;
    fStack_110 = local_d8._8_4_ + fStack_110;
    fStack_10c = local_d8._12_4_ + fStack_10c;
    fStack_108 = local_d8._16_4_ + fStack_108;
    fStack_104 = local_d8._20_4_ + fStack_104;
    fStack_100 = local_d8._24_4_ + fStack_100;
    fStack_fc = local_d8._28_4_ + auVar16._28_4_;
    local_138 = local_138 + auVar178._0_4_;
    fStack_134 = fStack_134 + auVar178._4_4_;
    fStack_130 = fStack_130 + auVar178._8_4_;
    fStack_12c = fStack_12c + auVar178._12_4_;
    fStack_128 = fStack_128 + auVar178._16_4_;
    fStack_124 = fStack_124 + auVar178._20_4_;
    fStack_120 = fStack_120 + auVar178._24_4_;
    fStack_11c = fVar313 + auVar178._28_4_;
    auVar31._4_4_ = fVar200 * fStack_134;
    auVar31._0_4_ = fVar135 * local_138;
    auVar31._8_4_ = fVar162 * fStack_130;
    auVar31._12_4_ = fVar215 * fStack_12c;
    auVar31._16_4_ = fVar163 * fStack_128;
    auVar31._20_4_ = fVar216 * fStack_124;
    auVar31._24_4_ = fVar164 * fStack_120;
    auVar31._28_4_ = fVar313;
    auVar32._4_4_ = fVar165 * fStack_114;
    auVar32._0_4_ = fVar217 * local_118;
    auVar32._8_4_ = fVar218 * fStack_110;
    auVar32._12_4_ = fVar166 * fStack_10c;
    auVar32._16_4_ = fVar219 * fStack_108;
    auVar32._20_4_ = fVar167 * fStack_104;
    auVar32._24_4_ = fVar220 * fStack_100;
    auVar32._28_4_ = fVar313 + auVar178._28_4_;
    auVar16 = vsubps_avx(auVar31,auVar32);
    auVar33._4_4_ = fVar200 * (float)local_468._4_4_;
    auVar33._0_4_ = fVar135 * (float)local_468._0_4_;
    auVar33._8_4_ = fVar162 * fStack_460;
    auVar33._12_4_ = fVar215 * fStack_45c;
    auVar33._16_4_ = fVar163 * fStack_458;
    auVar33._20_4_ = fVar216 * fStack_454;
    auVar33._24_4_ = fVar164 * fStack_450;
    auVar33._28_4_ = fVar313;
    auVar34._4_4_ = fVar165 * (float)local_4c8._4_4_;
    auVar34._0_4_ = fVar217 * (float)local_4c8._0_4_;
    auVar34._8_4_ = fVar218 * fStack_4c0;
    auVar34._12_4_ = fVar166 * fStack_4bc;
    auVar34._16_4_ = fVar219 * fStack_4b8;
    auVar34._20_4_ = fVar167 * fStack_4b4;
    auVar34._24_4_ = fVar220 * fStack_4b0;
    auVar34._28_4_ = local_d8._28_4_;
    auVar22 = vsubps_avx(auVar33,auVar34);
    auVar35._4_4_ = local_f8._4_4_ * fVar200;
    auVar35._0_4_ = local_f8._0_4_ * fVar135;
    auVar35._8_4_ = local_f8._8_4_ * fVar162;
    auVar35._12_4_ = local_f8._12_4_ * fVar215;
    auVar35._16_4_ = local_f8._16_4_ * fVar163;
    auVar35._20_4_ = local_f8._20_4_ * fVar216;
    auVar35._24_4_ = local_f8._24_4_ * fVar164;
    auVar35._28_4_ = fVar313;
    auVar36._4_4_ = local_2d8._4_4_ * fVar165;
    auVar36._0_4_ = local_2d8._0_4_ * fVar217;
    auVar36._8_4_ = local_2d8._8_4_ * fVar218;
    auVar36._12_4_ = local_2d8._12_4_ * fVar166;
    auVar36._16_4_ = local_2d8._16_4_ * fVar219;
    auVar36._20_4_ = local_2d8._20_4_ * fVar167;
    auVar36._24_4_ = local_2d8._24_4_ * fVar220;
    auVar36._28_4_ = local_f8._28_4_;
    auVar23 = vsubps_avx(auVar35,auVar36);
    auVar37._4_4_ = auVar273._4_4_ * fVar200;
    auVar37._0_4_ = auVar273._0_4_ * fVar135;
    auVar37._8_4_ = auVar273._8_4_ * fVar162;
    auVar37._12_4_ = auVar273._12_4_ * fVar215;
    auVar37._16_4_ = auVar273._16_4_ * fVar163;
    auVar37._20_4_ = auVar273._20_4_ * fVar216;
    auVar37._24_4_ = auVar273._24_4_ * fVar164;
    auVar37._28_4_ = fVar313;
    auVar38._4_4_ = fVar165 * auVar249._4_4_;
    auVar38._0_4_ = fVar217 * auVar249._0_4_;
    auVar38._8_4_ = fVar218 * auVar249._8_4_;
    auVar38._12_4_ = fVar166 * auVar249._12_4_;
    auVar38._16_4_ = fVar219 * auVar249._16_4_;
    auVar38._20_4_ = fVar167 * auVar249._20_4_;
    auVar38._24_4_ = fVar220 * auVar249._24_4_;
    auVar38._28_4_ = fStack_fc;
    auVar24 = vsubps_avx(auVar37,auVar38);
    local_158 = auVar249._0_4_ + local_158;
    fStack_154 = auVar249._4_4_ + fStack_154;
    fStack_150 = auVar249._8_4_ + fStack_150;
    fStack_14c = auVar249._12_4_ + fStack_14c;
    fStack_148 = auVar249._16_4_ + fStack_148;
    fStack_144 = auVar249._20_4_ + fStack_144;
    fStack_140 = auVar249._24_4_ + fStack_140;
    fStack_13c = auVar249._28_4_ + auVar15._28_4_;
    local_178 = auVar273._0_4_ + local_178;
    fStack_174 = auVar273._4_4_ + fStack_174;
    fStack_170 = auVar273._8_4_ + fStack_170;
    fStack_16c = auVar273._12_4_ + fStack_16c;
    fStack_168 = auVar273._16_4_ + fStack_168;
    fStack_164 = auVar273._20_4_ + fStack_164;
    fStack_160 = auVar273._24_4_ + fStack_160;
    fStack_15c = auVar273._28_4_ + auVar214._28_4_;
    auVar39._4_4_ = fVar200 * fStack_174;
    auVar39._0_4_ = fVar135 * local_178;
    auVar39._8_4_ = fVar162 * fStack_170;
    auVar39._12_4_ = fVar215 * fStack_16c;
    auVar39._16_4_ = fVar163 * fStack_168;
    auVar39._20_4_ = fVar216 * fStack_164;
    auVar39._24_4_ = fVar164 * fStack_160;
    auVar39._28_4_ = auVar273._28_4_ + auVar214._28_4_;
    auVar40._4_4_ = fStack_154 * fVar165;
    auVar40._0_4_ = local_158 * fVar217;
    auVar40._8_4_ = fStack_150 * fVar218;
    auVar40._12_4_ = fStack_14c * fVar166;
    auVar40._16_4_ = fStack_148 * fVar219;
    auVar40._20_4_ = fStack_144 * fVar167;
    auVar40._24_4_ = fStack_140 * fVar220;
    auVar40._28_4_ = fStack_13c;
    auVar93 = vsubps_avx(auVar39,auVar40);
    auVar41._4_4_ = fVar200 * local_b8._4_4_;
    auVar41._0_4_ = fVar135 * local_b8._0_4_;
    auVar41._8_4_ = fVar162 * local_b8._8_4_;
    auVar41._12_4_ = fVar215 * local_b8._12_4_;
    auVar41._16_4_ = fVar163 * local_b8._16_4_;
    auVar41._20_4_ = fVar216 * local_b8._20_4_;
    auVar41._24_4_ = fVar164 * local_b8._24_4_;
    auVar41._28_4_ = fStack_13c;
    auVar42._4_4_ = fVar165 * (float)local_368._4_4_;
    auVar42._0_4_ = fVar217 * (float)local_368._0_4_;
    auVar42._8_4_ = fVar218 * fStack_360;
    auVar42._12_4_ = fVar166 * fStack_35c;
    auVar42._16_4_ = fVar219 * fStack_358;
    auVar42._20_4_ = fVar167 * fStack_354;
    auVar42._24_4_ = fVar220 * fStack_350;
    auVar42._28_4_ = local_b8._28_4_;
    auVar94 = vsubps_avx(auVar41,auVar42);
    auVar43._4_4_ = fVar200 * local_498._4_4_;
    auVar43._0_4_ = fVar135 * local_498._0_4_;
    auVar43._8_4_ = fVar162 * local_498._8_4_;
    auVar43._12_4_ = fVar215 * local_498._12_4_;
    auVar43._16_4_ = fVar163 * local_498._16_4_;
    auVar43._20_4_ = fVar216 * local_498._20_4_;
    auVar43._24_4_ = fVar164 * local_498._24_4_;
    auVar43._28_4_ = auVar18._28_4_ + auVar17._28_4_;
    auVar44._4_4_ = auVar19._4_4_ * fVar165;
    auVar44._0_4_ = auVar19._0_4_ * fVar217;
    auVar44._8_4_ = auVar19._8_4_ * fVar218;
    auVar44._12_4_ = auVar19._12_4_ * fVar166;
    auVar44._16_4_ = auVar19._16_4_ * fVar219;
    auVar44._20_4_ = auVar19._20_4_ * fVar167;
    auVar44._24_4_ = auVar19._24_4_ * fVar220;
    auVar44._28_4_ = auVar20._28_4_ + auVar92._28_4_;
    auVar20 = vsubps_avx(auVar43,auVar44);
    auVar15 = vminps_avx(auVar21,auVar16);
    auVar92 = vmaxps_avx(auVar21,auVar16);
    auVar16 = vminps_avx(auVar22,auVar23);
    auVar16 = vminps_avx(auVar15,auVar16);
    auVar15 = vmaxps_avx(auVar22,auVar23);
    auVar92 = vmaxps_avx(auVar92,auVar15);
    auVar17 = vminps_avx(auVar24,auVar93);
    auVar15 = vmaxps_avx(auVar24,auVar93);
    auVar18 = vminps_avx(auVar94,auVar20);
    auVar18 = vminps_avx(auVar17,auVar18);
    auVar18 = vminps_avx(auVar16,auVar18);
    auVar16 = vmaxps_avx(auVar94,auVar20);
    auVar15 = vmaxps_avx(auVar15,auVar16);
    auVar15 = vmaxps_avx(auVar92,auVar15);
    auVar92 = vcmpps_avx(auVar18,local_78,2);
    auVar15 = vcmpps_avx(auVar15,local_98,5);
    auVar92 = vandps_avx(auVar15,auVar92);
    auVar15 = local_198 & auVar92;
    if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0x7f,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar15 >> 0xbf,0) != '\0') ||
        (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar15[0x1f] < '\0')
    {
      auVar15 = vsubps_avx(_local_2d8,local_d8);
      auVar16 = vsubps_avx(auVar19,auVar249);
      fVar200 = auVar15._0_4_ + auVar16._0_4_;
      fVar162 = auVar15._4_4_ + auVar16._4_4_;
      fVar215 = auVar15._8_4_ + auVar16._8_4_;
      fVar163 = auVar15._12_4_ + auVar16._12_4_;
      fVar216 = auVar15._16_4_ + auVar16._16_4_;
      fVar164 = auVar15._20_4_ + auVar16._20_4_;
      fVar217 = auVar15._24_4_ + auVar16._24_4_;
      auVar18 = vsubps_avx(local_f8,auVar178);
      auVar20 = vsubps_avx(_local_498,auVar273);
      fVar165 = auVar18._0_4_ + auVar20._0_4_;
      fVar218 = auVar18._4_4_ + auVar20._4_4_;
      fVar166 = auVar18._8_4_ + auVar20._8_4_;
      fVar219 = auVar18._12_4_ + auVar20._12_4_;
      fVar167 = auVar18._16_4_ + auVar20._16_4_;
      fVar220 = auVar18._20_4_ + auVar20._20_4_;
      fVar221 = auVar18._24_4_ + auVar20._24_4_;
      fVar135 = auVar20._28_4_;
      auVar45._4_4_ = auVar178._4_4_ * fVar162;
      auVar45._0_4_ = auVar178._0_4_ * fVar200;
      auVar45._8_4_ = auVar178._8_4_ * fVar215;
      auVar45._12_4_ = auVar178._12_4_ * fVar163;
      auVar45._16_4_ = auVar178._16_4_ * fVar216;
      auVar45._20_4_ = auVar178._20_4_ * fVar164;
      auVar45._24_4_ = auVar178._24_4_ * fVar217;
      auVar45._28_4_ = auVar178._28_4_;
      auVar46._4_4_ = local_d8._4_4_ * fVar218;
      auVar46._0_4_ = local_d8._0_4_ * fVar165;
      auVar46._8_4_ = local_d8._8_4_ * fVar166;
      auVar46._12_4_ = local_d8._12_4_ * fVar219;
      auVar46._16_4_ = local_d8._16_4_ * fVar167;
      auVar46._20_4_ = local_d8._20_4_ * fVar220;
      auVar46._24_4_ = local_d8._24_4_ * fVar221;
      auVar46._28_4_ = local_d8._28_4_;
      auVar20 = vsubps_avx(auVar45,auVar46);
      auVar47._4_4_ = fVar162 * fStack_134;
      auVar47._0_4_ = fVar200 * local_138;
      auVar47._8_4_ = fVar215 * fStack_130;
      auVar47._12_4_ = fVar163 * fStack_12c;
      auVar47._16_4_ = fVar216 * fStack_128;
      auVar47._20_4_ = fVar164 * fStack_124;
      auVar47._24_4_ = fVar217 * fStack_120;
      auVar47._28_4_ = auVar178._28_4_;
      auVar48._4_4_ = fVar218 * fStack_114;
      auVar48._0_4_ = fVar165 * local_118;
      auVar48._8_4_ = fVar166 * fStack_110;
      auVar48._12_4_ = fVar219 * fStack_10c;
      auVar48._16_4_ = fVar167 * fStack_108;
      auVar48._20_4_ = fVar220 * fStack_104;
      auVar48._24_4_ = fVar221 * fStack_100;
      auVar48._28_4_ = fVar135;
      auVar21 = vsubps_avx(auVar47,auVar48);
      auVar49._4_4_ = fVar162 * (float)local_468._4_4_;
      auVar49._0_4_ = fVar200 * (float)local_468._0_4_;
      auVar49._8_4_ = fVar215 * fStack_460;
      auVar49._12_4_ = fVar163 * fStack_45c;
      auVar49._16_4_ = fVar216 * fStack_458;
      auVar49._20_4_ = fVar164 * fStack_454;
      auVar49._24_4_ = fVar217 * fStack_450;
      auVar49._28_4_ = fVar135;
      auVar50._4_4_ = fVar218 * (float)local_4c8._4_4_;
      auVar50._0_4_ = fVar165 * (float)local_4c8._0_4_;
      auVar50._8_4_ = fVar166 * fStack_4c0;
      auVar50._12_4_ = fVar219 * fStack_4bc;
      auVar50._16_4_ = fVar167 * fStack_4b8;
      auVar50._20_4_ = fVar220 * fStack_4b4;
      auVar50._24_4_ = fVar221 * fStack_4b0;
      auVar50._28_4_ = auVar17._28_4_;
      auVar22 = vsubps_avx(auVar49,auVar50);
      auVar51._4_4_ = local_f8._4_4_ * fVar162;
      auVar51._0_4_ = local_f8._0_4_ * fVar200;
      auVar51._8_4_ = local_f8._8_4_ * fVar215;
      auVar51._12_4_ = local_f8._12_4_ * fVar163;
      auVar51._16_4_ = local_f8._16_4_ * fVar216;
      auVar51._20_4_ = local_f8._20_4_ * fVar164;
      auVar51._24_4_ = local_f8._24_4_ * fVar217;
      auVar51._28_4_ = auVar17._28_4_;
      auVar52._4_4_ = local_2d8._4_4_ * fVar218;
      auVar52._0_4_ = local_2d8._0_4_ * fVar165;
      auVar52._8_4_ = local_2d8._8_4_ * fVar166;
      auVar52._12_4_ = local_2d8._12_4_ * fVar219;
      auVar52._16_4_ = local_2d8._16_4_ * fVar167;
      auVar52._20_4_ = local_2d8._20_4_ * fVar220;
      uVar2 = local_2d8._28_4_;
      auVar52._24_4_ = local_2d8._24_4_ * fVar221;
      auVar52._28_4_ = uVar2;
      auVar23 = vsubps_avx(auVar51,auVar52);
      auVar53._4_4_ = auVar273._4_4_ * fVar162;
      auVar53._0_4_ = auVar273._0_4_ * fVar200;
      auVar53._8_4_ = auVar273._8_4_ * fVar215;
      auVar53._12_4_ = auVar273._12_4_ * fVar163;
      auVar53._16_4_ = auVar273._16_4_ * fVar216;
      auVar53._20_4_ = auVar273._20_4_ * fVar164;
      auVar53._24_4_ = auVar273._24_4_ * fVar217;
      auVar53._28_4_ = uVar2;
      auVar54._4_4_ = auVar249._4_4_ * fVar218;
      auVar54._0_4_ = auVar249._0_4_ * fVar165;
      auVar54._8_4_ = auVar249._8_4_ * fVar166;
      auVar54._12_4_ = auVar249._12_4_ * fVar219;
      auVar54._16_4_ = auVar249._16_4_ * fVar167;
      auVar54._20_4_ = auVar249._20_4_ * fVar220;
      auVar54._24_4_ = auVar249._24_4_ * fVar221;
      auVar54._28_4_ = auVar249._28_4_;
      auVar24 = vsubps_avx(auVar53,auVar54);
      auVar55._4_4_ = fVar162 * fStack_174;
      auVar55._0_4_ = fVar200 * local_178;
      auVar55._8_4_ = fVar215 * fStack_170;
      auVar55._12_4_ = fVar163 * fStack_16c;
      auVar55._16_4_ = fVar216 * fStack_168;
      auVar55._20_4_ = fVar164 * fStack_164;
      auVar55._24_4_ = fVar217 * fStack_160;
      auVar55._28_4_ = uVar2;
      auVar56._4_4_ = fVar218 * fStack_154;
      auVar56._0_4_ = fVar165 * local_158;
      auVar56._8_4_ = fVar166 * fStack_150;
      auVar56._12_4_ = fVar219 * fStack_14c;
      auVar56._16_4_ = fVar167 * fStack_148;
      auVar56._20_4_ = fVar220 * fStack_144;
      auVar56._24_4_ = fVar221 * fStack_140;
      auVar56._28_4_ = auVar273._28_4_;
      auVar93 = vsubps_avx(auVar55,auVar56);
      auVar57._4_4_ = fVar162 * local_b8._4_4_;
      auVar57._0_4_ = fVar200 * local_b8._0_4_;
      auVar57._8_4_ = fVar215 * local_b8._8_4_;
      auVar57._12_4_ = fVar163 * local_b8._12_4_;
      auVar57._16_4_ = fVar216 * local_b8._16_4_;
      auVar57._20_4_ = fVar164 * local_b8._20_4_;
      auVar57._24_4_ = fVar217 * local_b8._24_4_;
      auVar57._28_4_ = auVar273._28_4_;
      auVar58._4_4_ = (float)local_368._4_4_ * fVar218;
      auVar58._0_4_ = (float)local_368._0_4_ * fVar165;
      auVar58._8_4_ = fStack_360 * fVar166;
      auVar58._12_4_ = fStack_35c * fVar219;
      auVar58._16_4_ = fStack_358 * fVar167;
      auVar58._20_4_ = fStack_354 * fVar220;
      auVar58._24_4_ = fStack_350 * fVar221;
      auVar58._28_4_ = local_f8._28_4_;
      auVar94 = vsubps_avx(auVar57,auVar58);
      auVar59._4_4_ = fVar162 * local_498._4_4_;
      auVar59._0_4_ = fVar200 * local_498._0_4_;
      auVar59._8_4_ = fVar215 * local_498._8_4_;
      auVar59._12_4_ = fVar163 * local_498._12_4_;
      auVar59._16_4_ = fVar216 * local_498._16_4_;
      auVar59._20_4_ = fVar164 * local_498._20_4_;
      auVar59._24_4_ = fVar217 * local_498._24_4_;
      auVar59._28_4_ = auVar15._28_4_ + auVar16._28_4_;
      auVar60._4_4_ = auVar19._4_4_ * fVar218;
      auVar60._0_4_ = auVar19._0_4_ * fVar165;
      auVar60._8_4_ = auVar19._8_4_ * fVar166;
      auVar60._12_4_ = auVar19._12_4_ * fVar219;
      auVar60._16_4_ = auVar19._16_4_ * fVar167;
      auVar60._20_4_ = auVar19._20_4_ * fVar220;
      auVar60._24_4_ = auVar19._24_4_ * fVar221;
      auVar60._28_4_ = auVar18._28_4_ + fVar135;
      auVar127 = vsubps_avx(auVar59,auVar60);
      auVar16 = vminps_avx(auVar20,auVar21);
      auVar15 = vmaxps_avx(auVar20,auVar21);
      auVar17 = vminps_avx(auVar22,auVar23);
      auVar17 = vminps_avx(auVar16,auVar17);
      auVar16 = vmaxps_avx(auVar22,auVar23);
      auVar15 = vmaxps_avx(auVar15,auVar16);
      auVar18 = vminps_avx(auVar24,auVar93);
      auVar16 = vmaxps_avx(auVar24,auVar93);
      auVar19 = vminps_avx(auVar94,auVar127);
      auVar18 = vminps_avx(auVar18,auVar19);
      auVar18 = vminps_avx(auVar17,auVar18);
      auVar17 = vmaxps_avx(auVar94,auVar127);
      auVar16 = vmaxps_avx(auVar16,auVar17);
      auVar16 = vmaxps_avx(auVar15,auVar16);
      auVar15 = vcmpps_avx(auVar18,local_78,2);
      auVar16 = vcmpps_avx(auVar16,local_98,5);
      auVar15 = vandps_avx(auVar16,auVar15);
      auVar92 = vandps_avx(local_198,auVar92);
      auVar16 = auVar92 & auVar15;
      if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar16 >> 0x7f,0) != '\0') ||
            (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar16 >> 0xbf,0) != '\0') ||
          (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar16[0x1f] < '\0') {
        auVar92 = vandps_avx(auVar15,auVar92);
        uVar67 = vmovmskps_avx(auVar92);
        if (uVar67 != 0) {
          auStack_2b8[uVar71] = uVar67 & 0xff;
          uVar3 = vmovlps_avx(local_238);
          *(undefined8 *)(afStack_1d8 + uVar71 * 2) = uVar3;
          uVar4 = vmovlps_avx(auVar255);
          auStack_58[uVar71] = uVar4;
          uVar71 = (ulong)((int)uVar71 + 1);
        }
      }
    }
LAB_009c26b8:
    do {
      do {
        do {
          do {
            _local_368 = auVar96;
            _local_468 = auVar95;
            if ((int)uVar71 == 0) {
              fVar135 = (ray->super_RayK<1>).tfar;
              auVar102._4_4_ = fVar135;
              auVar102._0_4_ = fVar135;
              auVar102._8_4_ = fVar135;
              auVar102._12_4_ = fVar135;
              auVar102._16_4_ = fVar135;
              auVar102._20_4_ = fVar135;
              auVar102._24_4_ = fVar135;
              auVar102._28_4_ = fVar135;
              auVar92 = vcmpps_avx(local_1b8,auVar102,2);
              uVar66 = vmovmskps_avx(auVar92);
              uVar66 = (uint)uVar72 & uVar66;
              goto LAB_009c1876;
            }
            uVar69 = (int)uVar71 - 1;
            uVar70 = (ulong)uVar69;
            uVar67 = auStack_2b8[uVar70];
            fVar135 = afStack_1d8[uVar70 * 2];
            fVar200 = afStack_1d8[uVar70 * 2 + 1];
            auVar321._8_8_ = 0;
            auVar321._0_8_ = auStack_58[uVar70];
            auVar327 = ZEXT1664(auVar321);
            uVar4 = 0;
            if (uVar67 != 0) {
              for (; (uVar67 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
              }
            }
            uVar67 = uVar67 - 1 & uVar67;
            auStack_2b8[uVar70] = uVar67;
            if (uVar67 == 0) {
              uVar71 = (ulong)uVar69;
            }
            auVar231 = ZEXT1664(local_378);
            auVar250 = ZEXT1664(local_388);
            auVar262 = ZEXT1664(local_398);
            auVar274 = ZEXT1664(local_3a8);
            auVar291 = ZEXT1664(local_3b8);
            auVar300 = ZEXT1664(local_3c8);
            auVar306 = ZEXT1664(local_3d8);
            auVar317 = ZEXT1664(local_3e8);
            fVar215 = (float)(uVar4 + 1) * 0.14285715;
            fVar162 = (1.0 - (float)uVar4 * 0.14285715) * fVar135 +
                      fVar200 * (float)uVar4 * 0.14285715;
            fVar135 = (1.0 - fVar215) * fVar135 + fVar200 * fVar215;
            fVar200 = fVar135 - fVar162;
            if (0.16666667 <= fVar200) {
              auVar81 = vinsertps_avx(ZEXT416((uint)fVar162),ZEXT416((uint)fVar135),0x10);
              auVar330 = ZEXT1664(auVar81);
              goto LAB_009c205e;
            }
            auVar81 = vshufps_avx(auVar321,auVar321,0x50);
            auVar108._8_4_ = 0x3f800000;
            auVar108._0_8_ = 0x3f8000003f800000;
            auVar108._12_4_ = 0x3f800000;
            auVar204 = vsubps_avx(auVar108,auVar81);
            fVar215 = auVar81._0_4_;
            fVar163 = auVar81._4_4_;
            fVar216 = auVar81._8_4_;
            fVar164 = auVar81._12_4_;
            fVar217 = auVar204._0_4_;
            fVar165 = auVar204._4_4_;
            fVar218 = auVar204._8_4_;
            fVar166 = auVar204._12_4_;
            auVar138._0_4_ = local_3b8._0_4_ * fVar215 + fVar217 * local_378._0_4_;
            auVar138._4_4_ = local_3b8._4_4_ * fVar163 + fVar165 * local_378._4_4_;
            auVar138._8_4_ = local_3b8._8_4_ * fVar216 + fVar218 * local_378._8_4_;
            auVar138._12_4_ = local_3b8._12_4_ * fVar164 + fVar166 * local_378._12_4_;
            auVar185._0_4_ = local_3c8._0_4_ * fVar215 + fVar217 * local_388._0_4_;
            auVar185._4_4_ = local_3c8._4_4_ * fVar163 + fVar165 * local_388._4_4_;
            auVar185._8_4_ = local_3c8._8_4_ * fVar216 + fVar218 * local_388._8_4_;
            auVar185._12_4_ = local_3c8._12_4_ * fVar164 + fVar166 * local_388._12_4_;
            auVar206._0_4_ = local_3d8._0_4_ * fVar215 + local_398._0_4_ * fVar217;
            auVar206._4_4_ = local_3d8._4_4_ * fVar163 + local_398._4_4_ * fVar165;
            auVar206._8_4_ = local_3d8._8_4_ * fVar216 + local_398._8_4_ * fVar218;
            auVar206._12_4_ = local_3d8._12_4_ * fVar164 + local_398._12_4_ * fVar166;
            auVar78._0_4_ = local_3e8._0_4_ * fVar215 + local_3a8._0_4_ * fVar217;
            auVar78._4_4_ = local_3e8._4_4_ * fVar163 + local_3a8._4_4_ * fVar165;
            auVar78._8_4_ = local_3e8._8_4_ * fVar216 + local_3a8._8_4_ * fVar218;
            auVar78._12_4_ = local_3e8._12_4_ * fVar164 + local_3a8._12_4_ * fVar166;
            auVar132._16_16_ = auVar138;
            auVar132._0_16_ = auVar138;
            auVar160._16_16_ = auVar185;
            auVar160._0_16_ = auVar185;
            auVar199._16_16_ = auVar206;
            auVar199._0_16_ = auVar206;
            _local_4c8 = ZEXT432((uint)fVar162);
            _local_468 = ZEXT416((uint)fVar135);
            auVar92 = ZEXT2032(CONCAT416(fVar135,ZEXT416((uint)fVar162)));
            auVar92 = vshufps_avx(auVar92,auVar92,0);
            auVar15 = vsubps_avx(auVar160,auVar132);
            fVar215 = auVar92._0_4_;
            fVar163 = auVar92._4_4_;
            fVar216 = auVar92._8_4_;
            fVar164 = auVar92._12_4_;
            fVar217 = auVar92._16_4_;
            fVar165 = auVar92._20_4_;
            fVar218 = auVar92._24_4_;
            auVar133._0_4_ = auVar138._0_4_ + auVar15._0_4_ * fVar215;
            auVar133._4_4_ = auVar138._4_4_ + auVar15._4_4_ * fVar163;
            auVar133._8_4_ = auVar138._8_4_ + auVar15._8_4_ * fVar216;
            auVar133._12_4_ = auVar138._12_4_ + auVar15._12_4_ * fVar164;
            auVar133._16_4_ = auVar138._0_4_ + auVar15._16_4_ * fVar217;
            auVar133._20_4_ = auVar138._4_4_ + auVar15._20_4_ * fVar165;
            auVar133._24_4_ = auVar138._8_4_ + auVar15._24_4_ * fVar218;
            auVar133._28_4_ = auVar138._12_4_ + auVar15._28_4_;
            auVar92 = vsubps_avx(auVar199,auVar160);
            auVar161._0_4_ = auVar185._0_4_ + auVar92._0_4_ * fVar215;
            auVar161._4_4_ = auVar185._4_4_ + auVar92._4_4_ * fVar163;
            auVar161._8_4_ = auVar185._8_4_ + auVar92._8_4_ * fVar216;
            auVar161._12_4_ = auVar185._12_4_ + auVar92._12_4_ * fVar164;
            auVar161._16_4_ = auVar185._0_4_ + auVar92._16_4_ * fVar217;
            auVar161._20_4_ = auVar185._4_4_ + auVar92._20_4_ * fVar165;
            auVar161._24_4_ = auVar185._8_4_ + auVar92._24_4_ * fVar218;
            auVar161._28_4_ = auVar185._12_4_ + auVar92._28_4_;
            auVar81 = vsubps_avx(auVar78,auVar206);
            auVar100._0_4_ = auVar206._0_4_ + auVar81._0_4_ * fVar215;
            auVar100._4_4_ = auVar206._4_4_ + auVar81._4_4_ * fVar163;
            auVar100._8_4_ = auVar206._8_4_ + auVar81._8_4_ * fVar216;
            auVar100._12_4_ = auVar206._12_4_ + auVar81._12_4_ * fVar164;
            auVar100._16_4_ = auVar206._0_4_ + auVar81._0_4_ * fVar217;
            auVar100._20_4_ = auVar206._4_4_ + auVar81._4_4_ * fVar165;
            auVar100._24_4_ = auVar206._8_4_ + auVar81._8_4_ * fVar218;
            auVar100._28_4_ = auVar206._12_4_ + auVar81._12_4_;
            auVar92 = vsubps_avx(auVar161,auVar133);
            auVar134._0_4_ = auVar133._0_4_ + fVar215 * auVar92._0_4_;
            auVar134._4_4_ = auVar133._4_4_ + fVar163 * auVar92._4_4_;
            auVar134._8_4_ = auVar133._8_4_ + fVar216 * auVar92._8_4_;
            auVar134._12_4_ = auVar133._12_4_ + fVar164 * auVar92._12_4_;
            auVar134._16_4_ = auVar133._16_4_ + fVar217 * auVar92._16_4_;
            auVar134._20_4_ = auVar133._20_4_ + fVar165 * auVar92._20_4_;
            auVar134._24_4_ = auVar133._24_4_ + fVar218 * auVar92._24_4_;
            auVar134._28_4_ = auVar133._28_4_ + auVar92._28_4_;
            auVar92 = vsubps_avx(auVar100,auVar161);
            auVar101._0_4_ = auVar161._0_4_ + fVar215 * auVar92._0_4_;
            auVar101._4_4_ = auVar161._4_4_ + fVar163 * auVar92._4_4_;
            auVar101._8_4_ = auVar161._8_4_ + fVar216 * auVar92._8_4_;
            auVar101._12_4_ = auVar161._12_4_ + fVar164 * auVar92._12_4_;
            auVar101._16_4_ = auVar161._16_4_ + fVar217 * auVar92._16_4_;
            auVar101._20_4_ = auVar161._20_4_ + fVar165 * auVar92._20_4_;
            auVar101._24_4_ = auVar161._24_4_ + fVar218 * auVar92._24_4_;
            auVar101._28_4_ = auVar161._28_4_ + auVar92._28_4_;
            auVar92 = vsubps_avx(auVar101,auVar134);
            auVar228._0_4_ = auVar134._0_4_ + fVar215 * auVar92._0_4_;
            auVar228._4_4_ = auVar134._4_4_ + fVar163 * auVar92._4_4_;
            auVar228._8_4_ = auVar134._8_4_ + fVar216 * auVar92._8_4_;
            auVar228._12_4_ = auVar134._12_4_ + fVar164 * auVar92._12_4_;
            auVar230._16_4_ = auVar134._16_4_ + fVar217 * auVar92._16_4_;
            auVar230._0_16_ = auVar228;
            auVar230._20_4_ = auVar134._20_4_ + fVar165 * auVar92._20_4_;
            auVar230._24_4_ = auVar134._24_4_ + fVar218 * auVar92._24_4_;
            auVar230._28_4_ = auVar134._28_4_ + auVar161._28_4_;
            auVar236 = auVar230._16_16_;
            auVar110 = vshufps_avx(ZEXT416((uint)(fVar200 * 0.33333334)),
                                   ZEXT416((uint)(fVar200 * 0.33333334)),0);
            auVar186._0_4_ = auVar228._0_4_ + auVar110._0_4_ * auVar92._0_4_ * 3.0;
            auVar186._4_4_ = auVar228._4_4_ + auVar110._4_4_ * auVar92._4_4_ * 3.0;
            auVar186._8_4_ = auVar228._8_4_ + auVar110._8_4_ * auVar92._8_4_ * 3.0;
            auVar186._12_4_ = auVar228._12_4_ + auVar110._12_4_ * auVar92._12_4_ * 3.0;
            auVar154 = vshufpd_avx(auVar228,auVar228,3);
            auVar122 = vshufpd_avx(auVar236,auVar236,3);
            _local_2d8 = auVar154;
            auVar81 = vsubps_avx(auVar154,auVar228);
            _local_498 = auVar122;
            auVar204 = vsubps_avx(auVar122,auVar236);
            auVar79._0_4_ = auVar81._0_4_ + auVar204._0_4_;
            auVar79._4_4_ = auVar81._4_4_ + auVar204._4_4_;
            auVar79._8_4_ = auVar81._8_4_ + auVar204._8_4_;
            auVar79._12_4_ = auVar81._12_4_ + auVar204._12_4_;
            auVar81 = vmovshdup_avx(auVar228);
            auVar204 = vmovshdup_avx(auVar186);
            auVar140 = vshufps_avx(auVar79,auVar79,0);
            auVar111 = vshufps_avx(auVar79,auVar79,0x55);
            fVar215 = auVar111._0_4_;
            fVar163 = auVar111._4_4_;
            fVar216 = auVar111._8_4_;
            fVar164 = auVar111._12_4_;
            fVar217 = auVar140._0_4_;
            fVar165 = auVar140._4_4_;
            fVar218 = auVar140._8_4_;
            fVar166 = auVar140._12_4_;
            auVar80._0_4_ = fVar217 * auVar228._0_4_ + auVar81._0_4_ * fVar215;
            auVar80._4_4_ = fVar165 * auVar228._4_4_ + auVar81._4_4_ * fVar163;
            auVar80._8_4_ = fVar218 * auVar228._8_4_ + auVar81._8_4_ * fVar216;
            auVar80._12_4_ = fVar166 * auVar228._12_4_ + auVar81._12_4_ * fVar164;
            _local_368 = auVar186;
            auVar293._0_4_ = fVar217 * auVar186._0_4_ + auVar204._0_4_ * fVar215;
            auVar293._4_4_ = fVar165 * auVar186._4_4_ + auVar204._4_4_ * fVar163;
            auVar293._8_4_ = fVar218 * auVar186._8_4_ + auVar204._8_4_ * fVar216;
            auVar293._12_4_ = fVar166 * auVar186._12_4_ + auVar204._12_4_ * fVar164;
            auVar204 = vshufps_avx(auVar80,auVar80,0xe8);
            auVar140 = vshufps_avx(auVar293,auVar293,0xe8);
            auVar81 = vcmpps_avx(auVar204,auVar140,1);
            uVar67 = vextractps_avx(auVar81,0);
            auVar111 = auVar293;
            if ((uVar67 & 1) == 0) {
              auVar111 = auVar80;
            }
            auVar109._0_4_ = auVar110._0_4_ * auVar92._16_4_ * 3.0;
            auVar109._4_4_ = auVar110._4_4_ * auVar92._20_4_ * 3.0;
            auVar109._8_4_ = auVar110._8_4_ * auVar92._24_4_ * 3.0;
            auVar109._12_4_ = auVar110._12_4_ * 0.0;
            auVar7 = vsubps_avx(auVar236,auVar109);
            auVar110 = vmovshdup_avx(auVar7);
            auVar236 = vmovshdup_avx(auVar236);
            fVar219 = auVar7._0_4_;
            fVar167 = auVar7._4_4_;
            auVar207._0_4_ = fVar219 * fVar217 + auVar110._0_4_ * fVar215;
            auVar207._4_4_ = fVar167 * fVar165 + auVar110._4_4_ * fVar163;
            auVar207._8_4_ = auVar7._8_4_ * fVar218 + auVar110._8_4_ * fVar216;
            auVar207._12_4_ = auVar7._12_4_ * fVar166 + auVar110._12_4_ * fVar164;
            auVar328._0_4_ = fVar217 * auVar230._16_4_ + auVar236._0_4_ * fVar215;
            auVar328._4_4_ = fVar165 * auVar230._20_4_ + auVar236._4_4_ * fVar163;
            auVar328._8_4_ = fVar218 * auVar230._24_4_ + auVar236._8_4_ * fVar216;
            auVar328._12_4_ = fVar166 * auVar230._28_4_ + auVar236._12_4_ * fVar164;
            auVar236 = vshufps_avx(auVar207,auVar207,0xe8);
            auVar6 = vshufps_avx(auVar328,auVar328,0xe8);
            auVar110 = vcmpps_avx(auVar236,auVar6,1);
            uVar67 = vextractps_avx(auVar110,0);
            auVar255 = auVar328;
            if ((uVar67 & 1) == 0) {
              auVar255 = auVar207;
            }
            auVar111 = vmaxss_avx(auVar255,auVar111);
            auVar204 = vminps_avx(auVar204,auVar140);
            auVar140 = vminps_avx(auVar236,auVar6);
            auVar140 = vminps_avx(auVar204,auVar140);
            auVar81 = vshufps_avx(auVar81,auVar81,0x55);
            auVar81 = vblendps_avx(auVar81,auVar110,2);
            auVar110 = vpslld_avx(auVar81,0x1f);
            auVar81 = vshufpd_avx(auVar293,auVar293,1);
            auVar81 = vinsertps_avx(auVar81,auVar328,0x9c);
            auVar204 = vshufpd_avx(auVar80,auVar80,1);
            auVar204 = vinsertps_avx(auVar204,auVar207,0x9c);
            auVar81 = vblendvps_avx(auVar204,auVar81,auVar110);
            auVar204 = vmovshdup_avx(auVar81);
            auVar81 = vmaxss_avx(auVar204,auVar81);
            fVar216 = auVar140._0_4_;
            auVar204 = vmovshdup_avx(auVar140);
            fVar163 = auVar81._0_4_;
            fVar164 = auVar204._0_4_;
            fVar215 = auVar111._0_4_;
            auVar95 = _local_468;
            auVar96 = _local_368;
            if ((fVar216 < 0.0001) && (-0.0001 < fVar163)) break;
            if ((fVar164 < 0.0001 && -0.0001 < fVar215) || (fVar216 < 0.0001 && -0.0001 < fVar215))
            break;
            auVar110 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar81,1);
            auVar204 = vcmpps_avx(auVar204,SUB6416(ZEXT464(0x38d1b717),0),1);
            auVar204 = vandps_avx(auVar204,auVar110);
          } while ((auVar204 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
          auVar110 = vcmpps_avx(auVar140,_DAT_01f45a50,1);
          auVar204 = vcmpss_avx(auVar111,ZEXT416(0) << 0x20,1);
          auVar139._8_4_ = 0x3f800000;
          auVar139._0_8_ = 0x3f8000003f800000;
          auVar139._12_4_ = 0x3f800000;
          auVar187._8_4_ = 0xbf800000;
          auVar187._0_8_ = 0xbf800000bf800000;
          auVar187._12_4_ = 0xbf800000;
          auVar204 = vblendvps_avx(auVar139,auVar187,auVar204);
          auVar110 = vblendvps_avx(auVar139,auVar187,auVar110);
          auVar140 = vcmpss_avx(auVar110,auVar204,4);
          auVar140 = vpshufd_avx(ZEXT416(auVar140._0_4_ & 1),0x50);
          auVar140 = vpslld_avx(auVar140,0x1f);
          auVar140 = vpsrad_avx(auVar140,0x1f);
          auVar140 = vpandn_avx(auVar140,_DAT_01f7afb0);
          auVar111 = vmovshdup_avx(auVar110);
          fVar217 = auVar111._0_4_;
          if ((auVar110._0_4_ != fVar217) || (NAN(auVar110._0_4_) || NAN(fVar217))) {
            if ((fVar164 != fVar216) || (NAN(fVar164) || NAN(fVar216))) {
              fVar216 = -fVar216 / (fVar164 - fVar216);
              auVar110 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar216) * 0.0 + fVar216)));
            }
            else {
              auVar110 = ZEXT816(0x3f80000000000000);
              if ((fVar216 != 0.0) || (NAN(fVar216))) {
                auVar110 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar236 = vcmpps_avx(auVar140,auVar110,1);
            auVar111 = vblendps_avx(auVar140,auVar110,2);
            auVar110 = vblendps_avx(auVar110,auVar140,2);
            auVar140 = vblendvps_avx(auVar110,auVar111,auVar236);
          }
          auVar81 = vcmpss_avx(auVar81,ZEXT416(0) << 0x20,1);
          auVar141._8_4_ = 0x3f800000;
          auVar141._0_8_ = 0x3f8000003f800000;
          auVar141._12_4_ = 0x3f800000;
          auVar188._8_4_ = 0xbf800000;
          auVar188._0_8_ = 0xbf800000bf800000;
          auVar188._12_4_ = 0xbf800000;
          auVar81 = vblendvps_avx(auVar141,auVar188,auVar81);
          fVar216 = auVar81._0_4_;
          if ((auVar204._0_4_ != fVar216) || (NAN(auVar204._0_4_) || NAN(fVar216))) {
            if ((fVar163 != fVar215) || (NAN(fVar163) || NAN(fVar215))) {
              fVar215 = -fVar215 / (fVar163 - fVar215);
              auVar81 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar215) * 0.0 + fVar215)));
            }
            else {
              auVar81 = ZEXT816(0x3f80000000000000);
              if ((fVar215 != 0.0) || (NAN(fVar215))) {
                auVar81 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar110 = vcmpps_avx(auVar140,auVar81,1);
            auVar204 = vblendps_avx(auVar140,auVar81,2);
            auVar81 = vblendps_avx(auVar81,auVar140,2);
            auVar140 = vblendvps_avx(auVar81,auVar204,auVar110);
          }
          if ((fVar217 != fVar216) || (NAN(fVar217) || NAN(fVar216))) {
            auVar82._8_4_ = 0x3f800000;
            auVar82._0_8_ = 0x3f8000003f800000;
            auVar82._12_4_ = 0x3f800000;
            auVar81 = vcmpps_avx(auVar140,auVar82,1);
            auVar204 = vinsertps_avx(auVar140,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar142._4_12_ = auVar140._4_12_;
            auVar142._0_4_ = 0x3f800000;
            auVar140 = vblendvps_avx(auVar142,auVar204,auVar81);
          }
          auVar81 = vcmpps_avx(auVar140,_DAT_01f46740,1);
          auVar62._12_4_ = 0;
          auVar62._0_12_ = auVar140._4_12_;
          auVar204 = vinsertps_avx(auVar140,ZEXT416(0x3f800000),0x10);
          auVar81 = vblendvps_avx(auVar204,auVar62 << 0x20,auVar81);
          auVar204 = vmovshdup_avx(auVar81);
        } while (auVar204._0_4_ < auVar81._0_4_);
        auVar83._0_4_ = auVar81._0_4_ + -0.1;
        auVar83._4_4_ = auVar81._4_4_ + 0.1;
        auVar83._8_4_ = auVar81._8_4_ + 0.0;
        auVar83._12_4_ = auVar81._12_4_ + 0.0;
        auVar110 = vshufpd_avx(auVar186,auVar186,3);
        register0x00001388 = 0x3f80000000000000;
        local_368 = 0x3f80000000000000;
        auVar81 = vcmpps_avx(auVar83,_local_368,1);
        auVar61._12_4_ = 0;
        auVar61._0_12_ = auVar83._4_12_;
        auVar204 = vinsertps_avx(auVar83,SUB6416(ZEXT464(0x3f800000),0),0x10);
        auVar81 = vblendvps_avx(auVar204,auVar61 << 0x20,auVar81);
        auVar204 = vshufpd_avx(auVar7,auVar7,3);
        auVar140 = vshufps_avx(auVar81,auVar81,0x50);
        auVar322._8_4_ = 0x3f800000;
        auVar322._0_8_ = 0x3f8000003f800000;
        auVar322._12_4_ = 0x3f800000;
        auVar111 = vsubps_avx(auVar322,auVar140);
        local_2d8._0_4_ = auVar154._0_4_;
        local_2d8._4_4_ = auVar154._4_4_;
        fStack_2d0 = auVar154._8_4_;
        fStack_2cc = auVar154._12_4_;
        fVar215 = auVar140._0_4_;
        fVar163 = auVar140._4_4_;
        fVar216 = auVar140._8_4_;
        fVar164 = auVar140._12_4_;
        local_498._0_4_ = auVar122._0_4_;
        local_498._4_4_ = auVar122._4_4_;
        fStack_490 = auVar122._8_4_;
        fStack_48c = auVar122._12_4_;
        fVar217 = auVar111._0_4_;
        fVar165 = auVar111._4_4_;
        fVar218 = auVar111._8_4_;
        fVar166 = auVar111._12_4_;
        auVar84._0_4_ = fVar215 * (float)local_2d8._0_4_ + fVar217 * auVar228._0_4_;
        auVar84._4_4_ = fVar163 * (float)local_2d8._4_4_ + fVar165 * auVar228._4_4_;
        auVar84._8_4_ = fVar216 * fStack_2d0 + fVar218 * auVar228._0_4_;
        auVar84._12_4_ = fVar164 * fStack_2cc + fVar166 * auVar228._4_4_;
        auVar208._0_4_ = auVar110._0_4_ * fVar215 + fVar217 * auVar186._0_4_;
        auVar208._4_4_ = auVar110._4_4_ * fVar163 + fVar165 * auVar186._4_4_;
        auVar208._8_4_ = auVar110._8_4_ * fVar216 + fVar218 * auVar186._0_4_;
        auVar208._12_4_ = auVar110._12_4_ * fVar164 + fVar166 * auVar186._4_4_;
        auVar244._0_4_ = auVar204._0_4_ * fVar215 + fVar217 * fVar219;
        auVar244._4_4_ = auVar204._4_4_ * fVar163 + fVar165 * fVar167;
        auVar244._8_4_ = auVar204._8_4_ * fVar216 + fVar218 * fVar219;
        auVar244._12_4_ = auVar204._12_4_ * fVar164 + fVar166 * fVar167;
        auVar285._0_4_ = fVar215 * (float)local_498._0_4_ + fVar217 * auVar230._16_4_;
        auVar285._4_4_ = fVar163 * (float)local_498._4_4_ + fVar165 * auVar230._20_4_;
        auVar285._8_4_ = fVar216 * fStack_490 + fVar218 * auVar230._16_4_;
        auVar285._12_4_ = fVar164 * fStack_48c + fVar166 * auVar230._20_4_;
        auVar122 = vsubps_avx(auVar322,auVar81);
        auVar204 = vmovshdup_avx(auVar321);
        auVar154 = vmovsldup_avx(auVar321);
        auVar329._0_4_ = auVar122._0_4_ * auVar154._0_4_ + auVar81._0_4_ * auVar204._0_4_;
        auVar329._4_4_ = auVar122._4_4_ * auVar154._4_4_ + auVar81._4_4_ * auVar204._4_4_;
        auVar329._8_4_ = auVar122._8_4_ * auVar154._8_4_ + auVar81._8_4_ * auVar204._8_4_;
        auVar329._12_4_ = auVar122._12_4_ * auVar154._12_4_ + auVar81._12_4_ * auVar204._12_4_;
        _local_498 = vmovshdup_avx(auVar329);
        auVar81 = vsubps_avx(auVar208,auVar84);
        auVar143._0_4_ = auVar81._0_4_ * 3.0;
        auVar143._4_4_ = auVar81._4_4_ * 3.0;
        auVar143._8_4_ = auVar81._8_4_ * 3.0;
        auVar143._12_4_ = auVar81._12_4_ * 3.0;
        auVar81 = vsubps_avx(auVar244,auVar208);
        auVar172._0_4_ = auVar81._0_4_ * 3.0;
        auVar172._4_4_ = auVar81._4_4_ * 3.0;
        auVar172._8_4_ = auVar81._8_4_ * 3.0;
        auVar172._12_4_ = auVar81._12_4_ * 3.0;
        auVar81 = vsubps_avx(auVar285,auVar244);
        auVar257._0_4_ = auVar81._0_4_ * 3.0;
        auVar257._4_4_ = auVar81._4_4_ * 3.0;
        auVar257._8_4_ = auVar81._8_4_ * 3.0;
        auVar257._12_4_ = auVar81._12_4_ * 3.0;
        auVar204 = vminps_avx(auVar172,auVar257);
        auVar81 = vmaxps_avx(auVar172,auVar257);
        auVar204 = vminps_avx(auVar143,auVar204);
        auVar81 = vmaxps_avx(auVar143,auVar81);
        auVar154 = vshufpd_avx(auVar204,auVar204,3);
        auVar122 = vshufpd_avx(auVar81,auVar81,3);
        auVar204 = vminps_avx(auVar204,auVar154);
        auVar81 = vmaxps_avx(auVar81,auVar122);
        auVar154 = vshufps_avx(ZEXT416((uint)(1.0 / fVar200)),ZEXT416((uint)(1.0 / fVar200)),0);
        auVar258._0_4_ = auVar154._0_4_ * auVar204._0_4_;
        auVar258._4_4_ = auVar154._4_4_ * auVar204._4_4_;
        auVar258._8_4_ = auVar154._8_4_ * auVar204._8_4_;
        auVar258._12_4_ = auVar154._12_4_ * auVar204._12_4_;
        auVar268._0_4_ = auVar154._0_4_ * auVar81._0_4_;
        auVar268._4_4_ = auVar154._4_4_ * auVar81._4_4_;
        auVar268._8_4_ = auVar154._8_4_ * auVar81._8_4_;
        auVar268._12_4_ = auVar154._12_4_ * auVar81._12_4_;
        auVar111 = ZEXT416((uint)(1.0 / (local_498._0_4_ - auVar329._0_4_)));
        auVar81 = vshufpd_avx(auVar84,auVar84,3);
        auVar204 = vshufpd_avx(auVar208,auVar208,3);
        auVar154 = vshufpd_avx(auVar244,auVar244,3);
        auVar122 = vshufpd_avx(auVar285,auVar285,3);
        auVar81 = vsubps_avx(auVar81,auVar84);
        auVar110 = vsubps_avx(auVar204,auVar208);
        auVar140 = vsubps_avx(auVar154,auVar244);
        auVar122 = vsubps_avx(auVar122,auVar285);
        auVar204 = vminps_avx(auVar81,auVar110);
        auVar81 = vmaxps_avx(auVar81,auVar110);
        auVar154 = vminps_avx(auVar140,auVar122);
        auVar154 = vminps_avx(auVar204,auVar154);
        auVar204 = vmaxps_avx(auVar140,auVar122);
        auVar81 = vmaxps_avx(auVar81,auVar204);
        auVar204 = vshufps_avx(auVar111,auVar111,0);
        auVar315._0_4_ = auVar204._0_4_ * auVar154._0_4_;
        auVar315._4_4_ = auVar204._4_4_ * auVar154._4_4_;
        auVar315._8_4_ = auVar204._8_4_ * auVar154._8_4_;
        auVar315._12_4_ = auVar204._12_4_ * auVar154._12_4_;
        auVar323._0_4_ = auVar204._0_4_ * auVar81._0_4_;
        auVar323._4_4_ = auVar204._4_4_ * auVar81._4_4_;
        auVar323._8_4_ = auVar204._8_4_ * auVar81._8_4_;
        auVar323._12_4_ = auVar204._12_4_ * auVar81._12_4_;
        auVar81 = vmovsldup_avx(auVar329);
        auVar286._4_12_ = auVar81._4_12_;
        auVar286._0_4_ = fVar162;
        auVar294._4_12_ = auVar329._4_12_;
        auVar294._0_4_ = fVar135;
        auVar173._0_4_ = (fVar162 + fVar135) * 0.5;
        auVar173._4_4_ = (auVar81._4_4_ + auVar329._4_4_) * 0.5;
        auVar173._8_4_ = (auVar81._8_4_ + auVar329._8_4_) * 0.5;
        auVar173._12_4_ = (auVar81._12_4_ + auVar329._12_4_) * 0.5;
        auVar81 = vshufps_avx(auVar173,auVar173,0);
        fVar215 = auVar81._0_4_;
        fVar163 = auVar81._4_4_;
        fVar216 = auVar81._8_4_;
        fVar164 = auVar81._12_4_;
        auVar112._0_4_ = fVar215 * (float)local_1e8._0_4_ + (float)local_328._0_4_;
        auVar112._4_4_ = fVar163 * (float)local_1e8._4_4_ + (float)local_328._4_4_;
        auVar112._8_4_ = fVar216 * fStack_1e0 + fStack_320;
        auVar112._12_4_ = fVar164 * fStack_1dc + fStack_31c;
        auVar144._0_4_ = fVar215 * (float)local_1f8._0_4_ + (float)local_338._0_4_;
        auVar144._4_4_ = fVar163 * (float)local_1f8._4_4_ + (float)local_338._4_4_;
        auVar144._8_4_ = fVar216 * fStack_1f0 + fStack_330;
        auVar144._12_4_ = fVar164 * fStack_1ec + fStack_32c;
        auVar209._0_4_ = fVar215 * (float)local_208._0_4_ + (float)local_348._0_4_;
        auVar209._4_4_ = fVar163 * (float)local_208._4_4_ + (float)local_348._4_4_;
        auVar209._8_4_ = fVar216 * fStack_200 + fStack_340;
        auVar209._12_4_ = fVar164 * fStack_1fc + fStack_33c;
        auVar81 = vsubps_avx(auVar144,auVar112);
        auVar113._0_4_ = auVar112._0_4_ + fVar215 * auVar81._0_4_;
        auVar113._4_4_ = auVar112._4_4_ + fVar163 * auVar81._4_4_;
        auVar113._8_4_ = auVar112._8_4_ + fVar216 * auVar81._8_4_;
        auVar113._12_4_ = auVar112._12_4_ + fVar164 * auVar81._12_4_;
        auVar81 = vsubps_avx(auVar209,auVar144);
        auVar145._0_4_ = auVar144._0_4_ + fVar215 * auVar81._0_4_;
        auVar145._4_4_ = auVar144._4_4_ + fVar163 * auVar81._4_4_;
        auVar145._8_4_ = auVar144._8_4_ + fVar216 * auVar81._8_4_;
        auVar145._12_4_ = auVar144._12_4_ + fVar164 * auVar81._12_4_;
        auVar81 = vsubps_avx(auVar145,auVar113);
        fVar215 = auVar113._0_4_ + fVar215 * auVar81._0_4_;
        fVar163 = auVar113._4_4_ + fVar163 * auVar81._4_4_;
        auVar85._0_8_ = CONCAT44(fVar163,fVar215);
        auVar85._8_4_ = auVar113._8_4_ + fVar216 * auVar81._8_4_;
        auVar85._12_4_ = auVar113._12_4_ + fVar164 * auVar81._12_4_;
        fVar216 = auVar81._0_4_ * 3.0;
        fVar164 = auVar81._4_4_ * 3.0;
        auVar114._0_8_ = CONCAT44(fVar164,fVar216);
        auVar114._8_4_ = auVar81._8_4_ * 3.0;
        auVar114._12_4_ = auVar81._12_4_ * 3.0;
        auVar146._8_8_ = auVar85._0_8_;
        auVar146._0_8_ = auVar85._0_8_;
        auVar81 = vshufpd_avx(auVar85,auVar85,3);
        auVar204 = vshufps_avx(auVar173,auVar173,0x55);
        auVar140 = vsubps_avx(auVar81,auVar146);
        auVar304._0_4_ = auVar140._0_4_ * auVar204._0_4_ + fVar215;
        auVar304._4_4_ = auVar140._4_4_ * auVar204._4_4_ + fVar163;
        auVar304._8_4_ = auVar140._8_4_ * auVar204._8_4_ + fVar215;
        auVar304._12_4_ = auVar140._12_4_ * auVar204._12_4_ + fVar163;
        auVar147._8_8_ = auVar114._0_8_;
        auVar147._0_8_ = auVar114._0_8_;
        auVar81 = vshufpd_avx(auVar114,auVar114,1);
        auVar81 = vsubps_avx(auVar81,auVar147);
        auVar115._0_4_ = auVar81._0_4_ * auVar204._0_4_ + fVar216;
        auVar115._4_4_ = auVar81._4_4_ * auVar204._4_4_ + fVar164;
        auVar115._8_4_ = auVar81._8_4_ * auVar204._8_4_ + fVar216;
        auVar115._12_4_ = auVar81._12_4_ * auVar204._12_4_ + fVar164;
        auVar204 = vmovshdup_avx(auVar115);
        auVar210._0_8_ = auVar204._0_8_ ^ 0x8000000080000000;
        auVar210._8_4_ = auVar204._8_4_ ^ 0x80000000;
        auVar210._12_4_ = auVar204._12_4_ ^ 0x80000000;
        auVar154 = vmovshdup_avx(auVar140);
        auVar81 = vunpcklps_avx(auVar154,auVar210);
        auVar122 = vshufps_avx(auVar81,auVar210,4);
        auVar86._0_8_ = auVar140._0_8_ ^ 0x8000000080000000;
        auVar86._8_4_ = -auVar140._8_4_;
        auVar86._12_4_ = -auVar140._12_4_;
        auVar81 = vmovlhps_avx(auVar86,auVar115);
        auVar110 = vshufps_avx(auVar81,auVar115,8);
        auVar81 = ZEXT416((uint)(auVar115._0_4_ * auVar154._0_4_ - auVar140._0_4_ * auVar204._0_4_))
        ;
        auVar204 = vshufps_avx(auVar81,auVar81,0);
        auVar81 = vdivps_avx(auVar122,auVar204);
        auVar204 = vdivps_avx(auVar110,auVar204);
        auVar110 = vinsertps_avx(auVar258,auVar315,0x1c);
        auVar140 = vinsertps_avx(auVar268,auVar323,0x1c);
        auVar111 = vinsertps_avx(auVar315,auVar258,0x4c);
        auVar236 = vinsertps_avx(auVar323,auVar268,0x4c);
        auVar154 = vmovsldup_avx(auVar81);
        auVar148._0_4_ = auVar154._0_4_ * auVar110._0_4_;
        auVar148._4_4_ = auVar154._4_4_ * auVar110._4_4_;
        auVar148._8_4_ = auVar154._8_4_ * auVar110._8_4_;
        auVar148._12_4_ = auVar154._12_4_ * auVar110._12_4_;
        auVar116._0_4_ = auVar140._0_4_ * auVar154._0_4_;
        auVar116._4_4_ = auVar140._4_4_ * auVar154._4_4_;
        auVar116._8_4_ = auVar140._8_4_ * auVar154._8_4_;
        auVar116._12_4_ = auVar140._12_4_ * auVar154._12_4_;
        auVar122 = vminps_avx(auVar148,auVar116);
        auVar154 = vmaxps_avx(auVar116,auVar148);
        auVar6 = vmovsldup_avx(auVar204);
        auVar324._0_4_ = auVar111._0_4_ * auVar6._0_4_;
        auVar324._4_4_ = auVar111._4_4_ * auVar6._4_4_;
        auVar324._8_4_ = auVar111._8_4_ * auVar6._8_4_;
        auVar324._12_4_ = auVar111._12_4_ * auVar6._12_4_;
        auVar149._0_4_ = auVar236._0_4_ * auVar6._0_4_;
        auVar149._4_4_ = auVar236._4_4_ * auVar6._4_4_;
        auVar149._8_4_ = auVar236._8_4_ * auVar6._8_4_;
        auVar149._12_4_ = auVar236._12_4_ * auVar6._12_4_;
        auVar6 = vminps_avx(auVar324,auVar149);
        auVar189._0_4_ = auVar122._0_4_ + auVar6._0_4_;
        auVar189._4_4_ = auVar122._4_4_ + auVar6._4_4_;
        auVar189._8_4_ = auVar122._8_4_ + auVar6._8_4_;
        auVar189._12_4_ = auVar122._12_4_ + auVar6._12_4_;
        auVar122 = vmaxps_avx(auVar149,auVar324);
        auVar6 = vsubps_avx(auVar286,auVar173);
        auVar7 = vsubps_avx(auVar294,auVar173);
        auVar117._0_4_ = auVar154._0_4_ + auVar122._0_4_;
        auVar117._4_4_ = auVar154._4_4_ + auVar122._4_4_;
        auVar117._8_4_ = auVar154._8_4_ + auVar122._8_4_;
        auVar117._12_4_ = auVar154._12_4_ + auVar122._12_4_;
        auVar150._8_8_ = 0x3f800000;
        auVar150._0_8_ = 0x3f800000;
        auVar154 = vsubps_avx(auVar150,auVar117);
        auVar122 = vsubps_avx(auVar150,auVar189);
        fVar218 = auVar6._0_4_;
        auVar190._0_4_ = fVar218 * auVar154._0_4_;
        fVar166 = auVar6._4_4_;
        auVar190._4_4_ = fVar166 * auVar154._4_4_;
        fVar219 = auVar6._8_4_;
        auVar190._8_4_ = fVar219 * auVar154._8_4_;
        fVar167 = auVar6._12_4_;
        auVar190._12_4_ = fVar167 * auVar154._12_4_;
        fVar216 = auVar7._0_4_;
        auVar118._0_4_ = fVar216 * auVar154._0_4_;
        fVar164 = auVar7._4_4_;
        auVar118._4_4_ = fVar164 * auVar154._4_4_;
        fVar217 = auVar7._8_4_;
        auVar118._8_4_ = fVar217 * auVar154._8_4_;
        fVar165 = auVar7._12_4_;
        auVar118._12_4_ = fVar165 * auVar154._12_4_;
        auVar295._0_4_ = fVar218 * auVar122._0_4_;
        auVar295._4_4_ = fVar166 * auVar122._4_4_;
        auVar295._8_4_ = fVar219 * auVar122._8_4_;
        auVar295._12_4_ = fVar167 * auVar122._12_4_;
        auVar151._0_4_ = fVar216 * auVar122._0_4_;
        auVar151._4_4_ = fVar164 * auVar122._4_4_;
        auVar151._8_4_ = fVar217 * auVar122._8_4_;
        auVar151._12_4_ = fVar165 * auVar122._12_4_;
        auVar154 = vminps_avx(auVar190,auVar295);
        auVar122 = vminps_avx(auVar118,auVar151);
        auVar6 = vminps_avx(auVar154,auVar122);
        auVar154 = vmaxps_avx(auVar295,auVar190);
        auVar122 = vmaxps_avx(auVar151,auVar118);
        auVar7 = vshufps_avx(auVar173,auVar173,0x54);
        auVar122 = vmaxps_avx(auVar122,auVar154);
        auVar255 = vshufps_avx(auVar304,auVar304,0);
        auVar8 = vshufps_avx(auVar304,auVar304,0x55);
        auVar154 = vhaddps_avx(auVar6,auVar6);
        auVar122 = vhaddps_avx(auVar122,auVar122);
        auVar174._0_4_ = auVar255._0_4_ * auVar81._0_4_ + auVar8._0_4_ * auVar204._0_4_;
        auVar174._4_4_ = auVar255._4_4_ * auVar81._4_4_ + auVar8._4_4_ * auVar204._4_4_;
        auVar174._8_4_ = auVar255._8_4_ * auVar81._8_4_ + auVar8._8_4_ * auVar204._8_4_;
        auVar174._12_4_ = auVar255._12_4_ * auVar81._12_4_ + auVar8._12_4_ * auVar204._12_4_;
        auVar6 = vsubps_avx(auVar7,auVar174);
        fVar215 = auVar6._0_4_ + auVar154._0_4_;
        fVar163 = auVar6._0_4_ + auVar122._0_4_;
        auVar154 = vmaxss_avx(ZEXT416((uint)fVar162),ZEXT416((uint)fVar215));
        auVar122 = vminss_avx(ZEXT416((uint)fVar163),ZEXT416((uint)fVar135));
        auVar96 = _local_368;
      } while (auVar122._0_4_ < auVar154._0_4_);
      auVar154 = vmovshdup_avx(auVar81);
      auVar87._0_4_ = auVar154._0_4_ * auVar110._0_4_;
      auVar87._4_4_ = auVar154._4_4_ * auVar110._4_4_;
      auVar87._8_4_ = auVar154._8_4_ * auVar110._8_4_;
      auVar87._12_4_ = auVar154._12_4_ * auVar110._12_4_;
      auVar119._0_4_ = auVar140._0_4_ * auVar154._0_4_;
      auVar119._4_4_ = auVar140._4_4_ * auVar154._4_4_;
      auVar119._8_4_ = auVar140._8_4_ * auVar154._8_4_;
      auVar119._12_4_ = auVar140._12_4_ * auVar154._12_4_;
      auVar122 = vminps_avx(auVar87,auVar119);
      auVar154 = vmaxps_avx(auVar119,auVar87);
      auVar110 = vmovshdup_avx(auVar204);
      auVar191._0_4_ = auVar111._0_4_ * auVar110._0_4_;
      auVar191._4_4_ = auVar111._4_4_ * auVar110._4_4_;
      auVar191._8_4_ = auVar111._8_4_ * auVar110._8_4_;
      auVar191._12_4_ = auVar111._12_4_ * auVar110._12_4_;
      auVar120._0_4_ = auVar236._0_4_ * auVar110._0_4_;
      auVar120._4_4_ = auVar236._4_4_ * auVar110._4_4_;
      auVar120._8_4_ = auVar236._8_4_ * auVar110._8_4_;
      auVar120._12_4_ = auVar236._12_4_ * auVar110._12_4_;
      auVar110 = vminps_avx(auVar191,auVar120);
      auVar152._0_4_ = auVar122._0_4_ + auVar110._0_4_;
      auVar152._4_4_ = auVar122._4_4_ + auVar110._4_4_;
      auVar152._8_4_ = auVar122._8_4_ + auVar110._8_4_;
      auVar152._12_4_ = auVar122._12_4_ + auVar110._12_4_;
      auVar122 = vmaxps_avx(auVar120,auVar191);
      auVar88._0_4_ = auVar154._0_4_ + auVar122._0_4_;
      auVar88._4_4_ = auVar154._4_4_ + auVar122._4_4_;
      auVar88._8_4_ = auVar154._8_4_ + auVar122._8_4_;
      auVar88._12_4_ = auVar154._12_4_ + auVar122._12_4_;
      auVar154 = vsubps_avx(_local_368,auVar88);
      auVar122 = vsubps_avx(_local_368,auVar152);
      auVar153._0_4_ = fVar218 * auVar154._0_4_;
      auVar153._4_4_ = fVar166 * auVar154._4_4_;
      auVar153._8_4_ = fVar219 * auVar154._8_4_;
      auVar153._12_4_ = fVar167 * auVar154._12_4_;
      auVar192._0_4_ = fVar218 * auVar122._0_4_;
      auVar192._4_4_ = fVar166 * auVar122._4_4_;
      auVar192._8_4_ = fVar219 * auVar122._8_4_;
      auVar192._12_4_ = fVar167 * auVar122._12_4_;
      auVar89._0_4_ = fVar216 * auVar154._0_4_;
      auVar89._4_4_ = fVar164 * auVar154._4_4_;
      auVar89._8_4_ = fVar217 * auVar154._8_4_;
      auVar89._12_4_ = fVar165 * auVar154._12_4_;
      auVar121._0_4_ = fVar216 * auVar122._0_4_;
      auVar121._4_4_ = fVar164 * auVar122._4_4_;
      auVar121._8_4_ = fVar217 * auVar122._8_4_;
      auVar121._12_4_ = fVar165 * auVar122._12_4_;
      auVar154 = vminps_avx(auVar153,auVar192);
      auVar122 = vminps_avx(auVar89,auVar121);
      auVar154 = vminps_avx(auVar154,auVar122);
      auVar122 = vmaxps_avx(auVar192,auVar153);
      auVar110 = vmaxps_avx(auVar121,auVar89);
      auVar154 = vhaddps_avx(auVar154,auVar154);
      auVar122 = vmaxps_avx(auVar110,auVar122);
      auVar122 = vhaddps_avx(auVar122,auVar122);
      auVar110 = vmovshdup_avx(auVar6);
      auVar140 = ZEXT416((uint)(auVar110._0_4_ + auVar154._0_4_));
      auVar154 = vmaxss_avx(auVar329,auVar140);
      auVar110 = ZEXT416((uint)(auVar110._0_4_ + auVar122._0_4_));
      auVar122 = vminss_avx(auVar110,_local_498);
    } while (auVar122._0_4_ < auVar154._0_4_);
    uVar67 = 0;
    if ((fVar162 < fVar215) && (fVar163 < fVar135)) {
      auVar154 = vcmpps_avx(auVar110,_local_498,1);
      auVar122 = vcmpps_avx(auVar329,auVar140,1);
      auVar154 = vandps_avx(auVar122,auVar154);
      uVar67 = auVar154._0_4_;
    }
    auVar259._8_4_ = 0x7fffffff;
    auVar259._0_8_ = 0x7fffffff7fffffff;
    auVar259._12_4_ = 0x7fffffff;
    if ((3 < (uint)uVar71 || fVar200 < 0.001) || (uVar67 & 1) != 0) {
      lVar68 = 0xc9;
      do {
        lVar68 = lVar68 + -1;
        if (lVar68 == 0) goto LAB_009c26b8;
        fVar200 = auVar6._0_4_;
        fVar135 = 1.0 - fVar200;
        auVar154 = ZEXT416((uint)(fVar135 * fVar135 * fVar135));
        auVar154 = vshufps_avx(auVar154,auVar154,0);
        auVar122 = ZEXT416((uint)(fVar200 * 3.0 * fVar135 * fVar135));
        auVar122 = vshufps_avx(auVar122,auVar122,0);
        auVar110 = ZEXT416((uint)(fVar135 * fVar200 * fVar200 * 3.0));
        auVar110 = vshufps_avx(auVar110,auVar110,0);
        auVar140 = ZEXT416((uint)(fVar200 * fVar200 * fVar200));
        auVar140 = vshufps_avx(auVar140,auVar140,0);
        fVar135 = (float)local_328._0_4_ * auVar154._0_4_ +
                  (float)local_338._0_4_ * auVar122._0_4_ +
                  (float)local_218._0_4_ * auVar140._0_4_ + (float)local_348._0_4_ * auVar110._0_4_;
        fVar200 = (float)local_328._4_4_ * auVar154._4_4_ +
                  (float)local_338._4_4_ * auVar122._4_4_ +
                  (float)local_218._4_4_ * auVar140._4_4_ + (float)local_348._4_4_ * auVar110._4_4_;
        auVar90._0_8_ = CONCAT44(fVar200,fVar135);
        auVar90._8_4_ =
             fStack_320 * auVar154._8_4_ +
             fStack_330 * auVar122._8_4_ + fStack_210 * auVar140._8_4_ + fStack_340 * auVar110._8_4_
        ;
        auVar90._12_4_ =
             fStack_31c * auVar154._12_4_ +
             fStack_32c * auVar122._12_4_ +
             fStack_20c * auVar140._12_4_ + fStack_33c * auVar110._12_4_;
        auVar123._8_8_ = auVar90._0_8_;
        auVar123._0_8_ = auVar90._0_8_;
        auVar122 = vshufpd_avx(auVar90,auVar90,1);
        auVar154 = vmovshdup_avx(auVar6);
        auVar122 = vsubps_avx(auVar122,auVar123);
        auVar91._0_4_ = auVar154._0_4_ * auVar122._0_4_ + fVar135;
        auVar91._4_4_ = auVar154._4_4_ * auVar122._4_4_ + fVar200;
        auVar91._8_4_ = auVar154._8_4_ * auVar122._8_4_ + fVar135;
        auVar91._12_4_ = auVar154._12_4_ * auVar122._12_4_ + fVar200;
        auVar154 = vshufps_avx(auVar91,auVar91,0);
        auVar122 = vshufps_avx(auVar91,auVar91,0x55);
        auVar124._0_4_ = auVar81._0_4_ * auVar154._0_4_ + auVar204._0_4_ * auVar122._0_4_;
        auVar124._4_4_ = auVar81._4_4_ * auVar154._4_4_ + auVar204._4_4_ * auVar122._4_4_;
        auVar124._8_4_ = auVar81._8_4_ * auVar154._8_4_ + auVar204._8_4_ * auVar122._8_4_;
        auVar124._12_4_ = auVar81._12_4_ * auVar154._12_4_ + auVar204._12_4_ * auVar122._12_4_;
        auVar6 = vsubps_avx(auVar6,auVar124);
        auVar154 = vandps_avx(auVar259,auVar91);
        auVar122 = vshufps_avx(auVar154,auVar154,0xf5);
        auVar154 = vmaxss_avx(auVar122,auVar154);
      } while ((float)local_228._0_4_ <= auVar154._0_4_);
      fVar135 = auVar6._0_4_;
      if ((0.0 <= fVar135) && (fVar135 <= 1.0)) {
        auVar81 = vmovshdup_avx(auVar6);
        fVar200 = auVar81._0_4_;
        if ((0.0 <= fVar200) && (fVar200 <= 1.0)) {
          auVar81 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                  ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
          auVar236 = vinsertps_avx(auVar81,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),0x28);
          aVar5 = (ray->super_RayK<1>).org.field_0;
          auVar81 = vsubps_avx(_local_3f8,(undefined1  [16])aVar5);
          auVar81 = vdpps_avx(auVar81,auVar236,0x7f);
          auVar204 = vsubps_avx(_local_428,(undefined1  [16])aVar5);
          auVar204 = vdpps_avx(auVar204,auVar236,0x7f);
          auVar154 = vsubps_avx(_local_438,(undefined1  [16])aVar5);
          auVar154 = vdpps_avx(auVar154,auVar236,0x7f);
          auVar122 = vsubps_avx(_local_418,(undefined1  [16])aVar5);
          auVar122 = vdpps_avx(auVar122,auVar236,0x7f);
          auVar110 = vsubps_avx(_local_408,(undefined1  [16])aVar5);
          auVar110 = vdpps_avx(auVar110,auVar236,0x7f);
          auVar140 = vsubps_avx(_local_448,(undefined1  [16])aVar5);
          auVar140 = vdpps_avx(auVar140,auVar236,0x7f);
          auVar111 = vsubps_avx(_local_2e8,(undefined1  [16])aVar5);
          auVar111 = vdpps_avx(auVar111,auVar236,0x7f);
          auVar65._4_4_ = fStack_474;
          auVar65._0_4_ = local_478;
          auVar65._8_4_ = fStack_470;
          auVar65._12_4_ = fStack_46c;
          auVar7 = vsubps_avx(auVar65,(undefined1  [16])aVar5);
          auVar236 = vdpps_avx(auVar7,auVar236,0x7f);
          fVar164 = 1.0 - fVar200;
          fVar217 = 1.0 - fVar135;
          fVar162 = auVar6._4_4_;
          fVar215 = auVar6._8_4_;
          fVar163 = auVar6._12_4_;
          fVar216 = fVar217 * fVar135 * fVar135 * 3.0;
          auVar211._0_4_ = fVar135 * fVar135 * fVar135;
          auVar211._4_4_ = fVar162 * fVar162 * fVar162;
          auVar211._8_4_ = fVar215 * fVar215 * fVar215;
          auVar211._12_4_ = fVar163 * fVar163 * fVar163;
          fVar162 = fVar135 * 3.0 * fVar217 * fVar217;
          fVar215 = fVar217 * fVar217 * fVar217;
          fVar135 = (fVar164 * auVar81._0_4_ + auVar110._0_4_ * fVar200) * fVar215 +
                    fVar162 * (auVar140._0_4_ * fVar200 + fVar164 * auVar204._0_4_) +
                    fVar216 * (auVar111._0_4_ * fVar200 + fVar164 * auVar154._0_4_) +
                    auVar211._0_4_ * (fVar164 * auVar122._0_4_ + fVar200 * auVar236._0_4_);
          if ((((ray->super_RayK<1>).org.field_0.m128[3] <= fVar135) &&
              (fVar200 = (ray->super_RayK<1>).tfar, fVar135 <= fVar200)) &&
             (pGVar10 = (context->scene->geometries).items[uVar66].ptr,
             (pGVar10->mask & (ray->super_RayK<1>).mask) != 0)) {
            auVar81 = vshufps_avx(auVar6,auVar6,0x55);
            auVar260._8_4_ = 0x3f800000;
            auVar260._0_8_ = 0x3f8000003f800000;
            auVar260._12_4_ = 0x3f800000;
            auVar204 = vsubps_avx(auVar260,auVar81);
            fVar163 = auVar81._0_4_;
            fVar164 = auVar81._4_4_;
            fVar165 = auVar81._8_4_;
            fVar218 = auVar81._12_4_;
            fVar166 = auVar204._0_4_;
            fVar219 = auVar204._4_4_;
            fVar167 = auVar204._8_4_;
            fVar220 = auVar204._12_4_;
            auVar269._0_4_ = fVar163 * (float)local_408._0_4_ + fVar166 * (float)local_3f8._0_4_;
            auVar269._4_4_ = fVar164 * (float)local_408._4_4_ + fVar219 * (float)local_3f8._4_4_;
            auVar269._8_4_ = fVar165 * fStack_400 + fVar167 * fStack_3f0;
            auVar269._12_4_ = fVar218 * fStack_3fc + fVar220 * fStack_3ec;
            auVar287._0_4_ = fVar163 * (float)local_448._0_4_ + fVar166 * (float)local_428._0_4_;
            auVar287._4_4_ = fVar164 * (float)local_448._4_4_ + fVar219 * (float)local_428._4_4_;
            auVar287._8_4_ = fVar165 * fStack_440 + fVar167 * fStack_420;
            auVar287._12_4_ = fVar218 * fStack_43c + fVar220 * fStack_41c;
            auVar296._0_4_ = fVar163 * (float)local_2e8._0_4_ + fVar166 * (float)local_438._0_4_;
            auVar296._4_4_ = fVar164 * (float)local_2e8._4_4_ + fVar219 * (float)local_438._4_4_;
            auVar296._8_4_ = fVar165 * fStack_2e0 + fVar167 * fStack_430;
            auVar296._12_4_ = fVar218 * fStack_2dc + fVar220 * fStack_42c;
            auVar245._0_4_ = fVar166 * (float)local_418._0_4_ + fVar163 * local_478;
            auVar245._4_4_ = fVar219 * (float)local_418._4_4_ + fVar164 * fStack_474;
            auVar245._8_4_ = fVar167 * fStack_410 + fVar165 * fStack_470;
            auVar245._12_4_ = fVar220 * fStack_40c + fVar218 * fStack_46c;
            auVar122 = vsubps_avx(auVar287,auVar269);
            auVar110 = vsubps_avx(auVar296,auVar287);
            auVar140 = vsubps_avx(auVar245,auVar296);
            auVar81 = vshufps_avx(auVar6,auVar6,0);
            fVar218 = auVar81._0_4_;
            fVar166 = auVar81._4_4_;
            fVar219 = auVar81._8_4_;
            fVar167 = auVar81._12_4_;
            auVar81 = vshufps_avx(ZEXT416((uint)fVar217),ZEXT416((uint)fVar217),0);
            fVar163 = auVar81._0_4_;
            fVar164 = auVar81._4_4_;
            fVar217 = auVar81._8_4_;
            fVar165 = auVar81._12_4_;
            auVar81 = vshufps_avx(auVar211,auVar211,0);
            auVar204 = vshufps_avx(ZEXT416((uint)fVar216),ZEXT416((uint)fVar216),0);
            auVar154 = vshufps_avx(ZEXT416((uint)fVar162),ZEXT416((uint)fVar162),0);
            auVar193._0_4_ =
                 ((auVar122._0_4_ * fVar163 + fVar218 * auVar110._0_4_) * fVar163 +
                 fVar218 * (auVar110._0_4_ * fVar163 + fVar218 * auVar140._0_4_)) * 3.0;
            auVar193._4_4_ =
                 ((auVar122._4_4_ * fVar164 + fVar166 * auVar110._4_4_) * fVar164 +
                 fVar166 * (auVar110._4_4_ * fVar164 + fVar166 * auVar140._4_4_)) * 3.0;
            auVar193._8_4_ =
                 ((auVar122._8_4_ * fVar217 + fVar219 * auVar110._8_4_) * fVar217 +
                 fVar219 * (auVar110._8_4_ * fVar217 + fVar219 * auVar140._8_4_)) * 3.0;
            auVar193._12_4_ =
                 ((auVar122._12_4_ * fVar165 + fVar167 * auVar110._12_4_) * fVar165 +
                 fVar167 * (auVar110._12_4_ * fVar165 + fVar167 * auVar140._12_4_)) * 3.0;
            auVar122 = vshufps_avx(ZEXT416((uint)fVar215),ZEXT416((uint)fVar215),0);
            auVar125._0_4_ =
                 auVar122._0_4_ * (float)local_248._0_4_ +
                 auVar154._0_4_ * (float)local_258._0_4_ +
                 auVar81._0_4_ * (float)local_278._0_4_ + auVar204._0_4_ * (float)local_268._0_4_;
            auVar125._4_4_ =
                 auVar122._4_4_ * (float)local_248._4_4_ +
                 auVar154._4_4_ * (float)local_258._4_4_ +
                 auVar81._4_4_ * (float)local_278._4_4_ + auVar204._4_4_ * (float)local_268._4_4_;
            auVar125._8_4_ =
                 auVar122._8_4_ * fStack_240 +
                 auVar154._8_4_ * fStack_250 +
                 auVar81._8_4_ * fStack_270 + auVar204._8_4_ * fStack_260;
            auVar125._12_4_ =
                 auVar122._12_4_ * fStack_23c +
                 auVar154._12_4_ * fStack_24c +
                 auVar81._12_4_ * fStack_26c + auVar204._12_4_ * fStack_25c;
            auVar81 = vshufps_avx(auVar193,auVar193,0xc9);
            auVar155._0_4_ = auVar125._0_4_ * auVar81._0_4_;
            auVar155._4_4_ = auVar125._4_4_ * auVar81._4_4_;
            auVar155._8_4_ = auVar125._8_4_ * auVar81._8_4_;
            auVar155._12_4_ = auVar125._12_4_ * auVar81._12_4_;
            auVar81 = vshufps_avx(auVar125,auVar125,0xc9);
            auVar126._0_4_ = auVar193._0_4_ * auVar81._0_4_;
            auVar126._4_4_ = auVar193._4_4_ * auVar81._4_4_;
            auVar126._8_4_ = auVar193._8_4_ * auVar81._8_4_;
            auVar126._12_4_ = auVar193._12_4_ * auVar81._12_4_;
            auVar204 = vsubps_avx(auVar126,auVar155);
            auVar81 = vshufps_avx(auVar204,auVar204,0xe9);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
              local_2a8 = vmovlps_avx(auVar81);
              local_2a0 = auVar204._0_4_;
              local_29c = vmovlps_avx(auVar6);
              local_294 = (uint)local_4a0;
              local_290 = uVar66;
              local_28c = context->user->instID[0];
              local_288 = context->user->instPrimID[0];
              (ray->super_RayK<1>).tfar = fVar135;
              local_4cc = -1;
              local_318.valid = &local_4cc;
              local_318.geometryUserPtr = pGVar10->userPtr;
              local_318.context = context->user;
              local_318.ray = (RTCRayN *)ray;
              local_318.hit = (RTCHitN *)&local_2a8;
              local_318.N = 1;
              if ((pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                 ((*pGVar10->intersectionFilterN)(&local_318), *local_318.valid != 0)) {
                p_Var11 = context->args->filter;
                if ((p_Var11 == (RTCFilterFunctionN)0x0) ||
                   ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                      RTC_RAY_QUERY_FLAG_INCOHERENT && (((pGVar10->field_8).field_0x2 & 0x40) == 0))
                    || ((*p_Var11)(&local_318), *local_318.valid != 0)))) {
                  (((Vec3f *)((long)local_318.ray + 0x30))->field_0).components[0] =
                       *(float *)local_318.hit;
                  (((Vec3f *)((long)local_318.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_318.hit + 4);
                  (((Vec3f *)((long)local_318.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_318.hit + 8);
                  *(float *)((long)local_318.ray + 0x3c) = *(float *)(local_318.hit + 0xc);
                  *(float *)((long)local_318.ray + 0x40) = *(float *)(local_318.hit + 0x10);
                  *(float *)((long)local_318.ray + 0x44) = *(float *)(local_318.hit + 0x14);
                  *(float *)((long)local_318.ray + 0x48) = *(float *)(local_318.hit + 0x18);
                  *(float *)((long)local_318.ray + 0x4c) = *(float *)(local_318.hit + 0x1c);
                  *(float *)((long)local_318.ray + 0x50) = *(float *)(local_318.hit + 0x20);
                  auVar95 = _local_468;
                  auVar96 = _local_368;
                  goto LAB_009c26b8;
                }
              }
              (ray->super_RayK<1>).tfar = fVar200;
              auVar95 = _local_468;
              auVar96 = _local_368;
              goto LAB_009c26b8;
            }
            (ray->super_RayK<1>).tfar = fVar135;
            uVar3 = vmovlps_avx(auVar81);
            *(undefined8 *)&(ray->Ng).field_0 = uVar3;
            (ray->Ng).field_0.field_0.z = auVar204._0_4_;
            uVar3 = vmovlps_avx(auVar6);
            ray->u = (float)(int)uVar3;
            ray->v = (float)(int)((ulong)uVar3 >> 0x20);
            ray->primID = (uint)local_4a0;
            ray->geomID = uVar66;
            ray->instID[0] = context->user->instID[0];
            ray->instPrimID[0] = context->user->instPrimID[0];
          }
        }
      }
      goto LAB_009c26b8;
    }
    auVar81 = vinsertps_avx(ZEXT416((uint)fVar162),ZEXT416((uint)fVar135),0x10);
    auVar330 = ZEXT1664(auVar81);
    auVar231 = ZEXT1664(local_378);
    auVar250 = ZEXT1664(local_388);
    auVar262 = ZEXT1664(local_398);
    auVar274 = ZEXT1664(local_3a8);
    auVar291 = ZEXT1664(local_3b8);
    auVar300 = ZEXT1664(local_3c8);
    auVar306 = ZEXT1664(local_3d8);
    auVar317 = ZEXT1664(local_3e8);
    auVar327 = ZEXT1664(auVar329);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          
          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }